

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<8,_8,_1,_false,_embree::avx512::SubGridIntersectorKMoeller<8,_8,_true>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  undefined8 *puVar1;
  uint uVar2;
  uint uVar3;
  ushort uVar4;
  ushort uVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  RTCRayQueryContext *pRVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  long lVar22;
  size_t k;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  ulong uVar50;
  byte bVar51;
  int iVar52;
  ulong uVar53;
  byte bVar54;
  long lVar55;
  ulong uVar56;
  byte bVar57;
  undefined1 (*pauVar58) [32];
  long lVar59;
  byte bVar60;
  ulong *puVar61;
  NodeRef root;
  ulong uVar62;
  long lVar63;
  float *pfVar64;
  uint i_1;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined4 uVar65;
  bool bVar66;
  ulong uVar67;
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar68 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  vfloat_impl<8> vVar85;
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  float fVar90;
  float fVar91;
  float fVar94;
  float fVar95;
  float fVar96;
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  float fVar103;
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar109 [32];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [64];
  undefined1 auVar117 [32];
  uint uVar119;
  undefined1 auVar118 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  float fVar125;
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [64];
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  undefined1 auVar130 [32];
  float fVar136;
  float fVar137;
  float fVar138;
  undefined1 auVar135 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [64];
  undefined1 auVar145 [36];
  undefined1 auVar144 [64];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [64];
  undefined1 auVar150 [64];
  undefined1 auVar151 [64];
  undefined1 auVar152 [64];
  undefined1 auVar153 [16];
  undefined1 in_ZMM26 [64];
  undefined1 auVar154 [64];
  undefined1 auVar155 [64];
  Precalculations pre;
  vfloat<8> upper_y;
  vfloat<8> lower_z;
  vfloat<8> upper_z;
  vfloat<8> lower_x;
  vfloat<8> t;
  vfloat<8> v;
  vfloat<8> lower_y;
  TravRayK<8,_false> tray;
  vfloat<8> upper_x;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  uint local_5fa4;
  uint local_5f90;
  Precalculations local_5f89;
  uint local_5f88;
  uint local_5f84;
  RTCFilterFunctionNArguments local_5f80;
  undefined1 local_5f40 [16];
  undefined1 local_5f30 [16];
  float local_5f20;
  float fStack_5f1c;
  float fStack_5f18;
  float fStack_5f14;
  float fStack_5f10;
  float fStack_5f0c;
  float fStack_5f08;
  float fStack_5f04;
  Geometry *local_5ef8;
  ulong local_5ef0;
  undefined4 local_5ee8;
  undefined4 local_5ee4;
  undefined1 local_5ee0 [8];
  float fStack_5ed8;
  float fStack_5ed4;
  float fStack_5ed0;
  float fStack_5ecc;
  float fStack_5ec8;
  float fStack_5ec4;
  undefined1 local_5ec0 [8];
  float fStack_5eb8;
  float fStack_5eb4;
  float fStack_5eb0;
  float fStack_5eac;
  float fStack_5ea8;
  float fStack_5ea4;
  undefined1 (*local_5e90) [32];
  RayK<8> *local_5e88;
  long local_5e80;
  long local_5e78;
  long local_5e70;
  ulong local_5e68;
  float local_5e60;
  float fStack_5e5c;
  float fStack_5e58;
  float fStack_5e54;
  float fStack_5e50;
  float fStack_5e4c;
  float fStack_5e48;
  float fStack_5e44;
  undefined1 local_5e40 [32];
  float local_5e20;
  float fStack_5e1c;
  float fStack_5e18;
  float fStack_5e14;
  float fStack_5e10;
  float fStack_5e0c;
  float fStack_5e08;
  float fStack_5e04;
  float local_5e00;
  float fStack_5dfc;
  float fStack_5df8;
  float fStack_5df4;
  float fStack_5df0;
  float fStack_5dec;
  float fStack_5de8;
  float fStack_5de4;
  BVH *local_5de0;
  Intersectors *local_5dd8;
  long local_5dd0;
  long local_5dc8;
  undefined1 local_5dc0 [32];
  undefined1 local_5da0 [16];
  undefined1 local_5d90 [16];
  undefined1 local_5d80 [32];
  undefined1 local_5d60 [32];
  undefined1 local_5d40 [32];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5d20;
  undefined8 local_5cc0;
  undefined8 uStack_5cb8;
  undefined8 uStack_5cb0;
  undefined8 uStack_5ca8;
  undefined1 local_5ca0 [8];
  float fStack_5c98;
  float fStack_5c94;
  float fStack_5c90;
  float fStack_5c8c;
  float fStack_5c88;
  float fStack_5c84;
  undefined1 local_5c80 [8];
  float fStack_5c78;
  float fStack_5c74;
  float fStack_5c70;
  float fStack_5c6c;
  float fStack_5c68;
  float fStack_5c64;
  undefined1 local_5c60 [32];
  uint local_5c40;
  uint uStack_5c3c;
  uint uStack_5c38;
  uint uStack_5c34;
  uint uStack_5c30;
  uint uStack_5c2c;
  uint uStack_5c28;
  uint uStack_5c24;
  uint local_5c20;
  uint uStack_5c1c;
  uint uStack_5c18;
  uint uStack_5c14;
  uint uStack_5c10;
  uint uStack_5c0c;
  uint uStack_5c08;
  uint uStack_5c04;
  undefined1 local_5c00 [32];
  undefined1 local_5be0 [32];
  undefined1 local_5bc0 [32];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_5ba0 [3];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5b40;
  undefined1 local_5ae0 [32];
  undefined1 local_5ac0 [32];
  undefined1 local_5aa0 [32];
  undefined1 local_5a80 [32];
  undefined1 local_5a60 [32];
  undefined1 local_5a40 [32];
  float local_5a20;
  float fStack_5a1c;
  float fStack_5a18;
  float fStack_5a14;
  float fStack_5a10;
  float fStack_5a0c;
  float fStack_5a08;
  undefined4 uStack_5a04;
  float local_5a00;
  float fStack_59fc;
  float fStack_59f8;
  float fStack_59f4;
  float fStack_59f0;
  float fStack_59ec;
  float fStack_59e8;
  undefined4 uStack_59e4;
  undefined1 local_59e0 [32];
  int local_59c0;
  int iStack_59bc;
  int iStack_59b8;
  int iStack_59b4;
  int iStack_59b0;
  int iStack_59ac;
  int iStack_59a8;
  int iStack_59a4;
  uint local_59a0;
  uint uStack_599c;
  uint uStack_5998;
  uint uStack_5994;
  uint uStack_5990;
  uint uStack_598c;
  uint uStack_5988;
  uint uStack_5984;
  uint local_5980;
  uint uStack_597c;
  uint uStack_5978;
  uint uStack_5974;
  uint uStack_5970;
  uint uStack_596c;
  uint uStack_5968;
  uint uStack_5964;
  undefined1 local_5960 [32];
  uint local_5940;
  uint uStack_593c;
  uint uStack_5938;
  uint uStack_5934;
  uint uStack_5930;
  uint uStack_592c;
  uint uStack_5928;
  uint uStack_5924;
  undefined1 local_5920 [32];
  undefined8 local_5900;
  undefined8 uStack_58f8;
  undefined1 local_58f0 [16];
  undefined8 local_58e0;
  undefined8 uStack_58d8;
  undefined1 local_58d0 [16];
  undefined8 local_58c0;
  undefined8 uStack_58b8;
  undefined8 local_58b0;
  undefined8 uStack_58a8;
  undefined1 local_58a0 [16];
  undefined8 local_5890;
  undefined8 uStack_5888;
  undefined8 local_5880;
  undefined8 uStack_5878;
  undefined1 local_5870 [16];
  undefined8 local_5860;
  undefined8 uStack_5858;
  undefined8 local_5850;
  undefined8 uStack_5848;
  undefined1 local_5840 [16];
  undefined8 local_5830;
  undefined8 uStack_5828;
  undefined8 local_5810;
  size_t local_5808;
  ulong local_5800 [560];
  undefined1 local_4680 [32];
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  undefined1 auVar143 [36];
  undefined1 auVar146 [36];
  
  local_5808 = (((BVH *)This->ptr)->root).ptr;
  if (local_5808 != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar73 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar68 = ZEXT816(0) << 0x40;
      uVar67 = vcmpps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar68),5);
      uVar62 = vpcmpeqd_avx512vl(auVar73,(undefined1  [32])valid_i->field_0);
      uVar67 = uVar67 & uVar62;
      bVar60 = (byte)uVar67;
      if (bVar60 != 0) {
        local_5b40._0_4_ = *(float *)ray;
        local_5b40._4_4_ = *(float *)(ray + 4);
        local_5b40._8_4_ = *(float *)(ray + 8);
        local_5b40._12_4_ = *(float *)(ray + 0xc);
        local_5b40._16_4_ = *(float *)(ray + 0x10);
        local_5b40._20_4_ = *(float *)(ray + 0x14);
        local_5b40._24_4_ = *(float *)(ray + 0x18);
        local_5b40._28_4_ = *(undefined4 *)(ray + 0x1c);
        local_5b40._32_4_ = *(float *)(ray + 0x20);
        local_5b40._36_4_ = *(float *)(ray + 0x24);
        local_5b40._40_4_ = *(float *)(ray + 0x28);
        local_5b40._44_4_ = *(float *)(ray + 0x2c);
        local_5b40._48_4_ = *(float *)(ray + 0x30);
        local_5b40._52_4_ = *(float *)(ray + 0x34);
        local_5b40._56_4_ = *(float *)(ray + 0x38);
        local_5b40._60_4_ = *(undefined4 *)(ray + 0x3c);
        local_5b40._64_4_ = *(float *)(ray + 0x40);
        local_5b40._68_4_ = *(float *)(ray + 0x44);
        local_5b40._72_4_ = *(float *)(ray + 0x48);
        local_5b40._76_4_ = *(float *)(ray + 0x4c);
        local_5b40._80_4_ = *(float *)(ray + 0x50);
        local_5b40._84_4_ = *(float *)(ray + 0x54);
        local_5b40._88_4_ = *(float *)(ray + 0x58);
        local_5b40._92_4_ = *(undefined4 *)(ray + 0x5c);
        local_5ae0 = *(undefined1 (*) [32])(ray + 0x80);
        local_5ac0 = *(undefined1 (*) [32])(ray + 0xa0);
        local_5aa0 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar73 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar149 = ZEXT3264(auVar73);
        vandps_avx512vl(local_5ae0,auVar73);
        auVar74._8_4_ = 0x219392ef;
        auVar74._0_8_ = 0x219392ef219392ef;
        auVar74._12_4_ = 0x219392ef;
        auVar74._16_4_ = 0x219392ef;
        auVar74._20_4_ = 0x219392ef;
        auVar74._24_4_ = 0x219392ef;
        auVar74._28_4_ = 0x219392ef;
        uVar62 = vcmpps_avx512vl(auVar73,auVar74,1);
        bVar66 = (bool)((byte)uVar62 & 1);
        auVar75._0_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * local_5ae0._0_4_;
        bVar66 = (bool)((byte)(uVar62 >> 1) & 1);
        auVar75._4_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * local_5ae0._4_4_;
        bVar66 = (bool)((byte)(uVar62 >> 2) & 1);
        auVar75._8_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * local_5ae0._8_4_;
        bVar66 = (bool)((byte)(uVar62 >> 3) & 1);
        auVar75._12_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * local_5ae0._12_4_;
        bVar66 = (bool)((byte)(uVar62 >> 4) & 1);
        auVar75._16_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * local_5ae0._16_4_;
        bVar66 = (bool)((byte)(uVar62 >> 5) & 1);
        auVar75._20_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * local_5ae0._20_4_;
        bVar66 = (bool)((byte)(uVar62 >> 6) & 1);
        auVar75._24_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * local_5ae0._24_4_;
        bVar66 = SUB81(uVar62 >> 7,0);
        auVar75._28_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * local_5ae0._28_4_;
        vandps_avx512vl(local_5ac0,auVar73);
        uVar62 = vcmpps_avx512vl(auVar75,auVar74,1);
        bVar66 = (bool)((byte)uVar62 & 1);
        auVar78._0_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * local_5ac0._0_4_;
        bVar66 = (bool)((byte)(uVar62 >> 1) & 1);
        auVar78._4_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * local_5ac0._4_4_;
        bVar66 = (bool)((byte)(uVar62 >> 2) & 1);
        auVar78._8_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * local_5ac0._8_4_;
        bVar66 = (bool)((byte)(uVar62 >> 3) & 1);
        auVar78._12_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * local_5ac0._12_4_;
        bVar66 = (bool)((byte)(uVar62 >> 4) & 1);
        auVar78._16_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * local_5ac0._16_4_;
        bVar66 = (bool)((byte)(uVar62 >> 5) & 1);
        auVar78._20_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * local_5ac0._20_4_;
        bVar66 = (bool)((byte)(uVar62 >> 6) & 1);
        auVar78._24_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * local_5ac0._24_4_;
        bVar66 = SUB81(uVar62 >> 7,0);
        auVar78._28_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * local_5ac0._28_4_;
        vandps_avx512vl(local_5aa0,auVar73);
        uVar62 = vcmpps_avx512vl(auVar78,auVar74,1);
        bVar66 = (bool)((byte)uVar62 & 1);
        auVar73._0_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * local_5aa0._0_4_;
        bVar66 = (bool)((byte)(uVar62 >> 1) & 1);
        auVar73._4_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * local_5aa0._4_4_;
        bVar66 = (bool)((byte)(uVar62 >> 2) & 1);
        auVar73._8_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * local_5aa0._8_4_;
        bVar66 = (bool)((byte)(uVar62 >> 3) & 1);
        auVar73._12_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * local_5aa0._12_4_;
        bVar66 = (bool)((byte)(uVar62 >> 4) & 1);
        auVar73._16_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * local_5aa0._16_4_;
        bVar66 = (bool)((byte)(uVar62 >> 5) & 1);
        auVar73._20_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * local_5aa0._20_4_;
        bVar66 = (bool)((byte)(uVar62 >> 6) & 1);
        auVar73._24_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * local_5aa0._24_4_;
        bVar66 = SUB81(uVar62 >> 7,0);
        auVar73._28_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * local_5aa0._28_4_;
        auVar76._8_4_ = 0x3f800000;
        auVar76._0_8_ = 0x3f8000003f800000;
        auVar76._12_4_ = 0x3f800000;
        auVar76._16_4_ = 0x3f800000;
        auVar76._20_4_ = 0x3f800000;
        auVar76._24_4_ = 0x3f800000;
        auVar76._28_4_ = 0x3f800000;
        auVar74 = vrcp14ps_avx512vl(auVar75);
        auVar70 = vfnmadd213ps_fma(auVar75,auVar74,auVar76);
        auVar70 = vfmadd132ps_fma(ZEXT1632(auVar70),auVar74,auVar74);
        auVar75 = vrcp14ps_avx512vl(auVar78);
        auVar147 = vfnmadd213ps_fma(auVar78,auVar75,auVar76);
        auVar147 = vfmadd132ps_fma(ZEXT1632(auVar147),auVar75,auVar75);
        auVar75 = vrcp14ps_avx512vl(auVar73);
        auVar72 = vfnmadd213ps_fma(auVar73,auVar75,auVar76);
        local_5a80 = ZEXT1632(auVar70);
        local_5a60 = ZEXT1632(auVar147);
        auVar72 = vfmadd132ps_fma(ZEXT1632(auVar72),auVar75,auVar75);
        local_5a40 = ZEXT1632(auVar72);
        local_59e0._4_4_ = *(float *)(ray + 0x44) * auVar72._4_4_;
        local_59e0._0_4_ = *(float *)(ray + 0x40) * auVar72._0_4_;
        local_59e0._8_4_ = *(float *)(ray + 0x48) * auVar72._8_4_;
        local_59e0._12_4_ = *(float *)(ray + 0x4c) * auVar72._12_4_;
        local_59e0._16_4_ = *(float *)(ray + 0x50) * 0.0;
        local_59e0._20_4_ = *(float *)(ray + 0x54) * 0.0;
        local_59e0._24_4_ = *(float *)(ray + 0x58) * 0.0;
        local_59e0._28_4_ = *(undefined4 *)(ray + 0x5c);
        local_5a20 = *(float *)ray * auVar70._0_4_;
        fStack_5a1c = *(float *)(ray + 4) * auVar70._4_4_;
        fStack_5a18 = *(float *)(ray + 8) * auVar70._8_4_;
        fStack_5a14 = *(float *)(ray + 0xc) * auVar70._12_4_;
        fStack_5a10 = *(float *)(ray + 0x10) * 0.0;
        fStack_5a0c = *(float *)(ray + 0x14) * 0.0;
        fStack_5a08 = *(float *)(ray + 0x18) * 0.0;
        uStack_5a04 = *(undefined4 *)(ray + 0x1c);
        local_5a00 = *(float *)(ray + 0x20) * auVar147._0_4_;
        fStack_59fc = *(float *)(ray + 0x24) * auVar147._4_4_;
        fStack_59f8 = *(float *)(ray + 0x28) * auVar147._8_4_;
        fStack_59f4 = *(float *)(ray + 0x2c) * auVar147._12_4_;
        fStack_59f0 = *(float *)(ray + 0x30) * 0.0;
        fStack_59ec = *(float *)(ray + 0x34) * 0.0;
        fStack_59e8 = *(float *)(ray + 0x38) * 0.0;
        uStack_59e4 = *(undefined4 *)(ray + 0x3c);
        uVar62 = vcmpps_avx512vl(ZEXT1632(auVar70),ZEXT1632(auVar68),1);
        auVar73 = vpbroadcastd_avx512vl(ZEXT416(0x20));
        local_59c0 = (uint)((byte)uVar62 & 1) * auVar73._0_4_;
        iStack_59bc = (uint)((byte)(uVar62 >> 1) & 1) * auVar73._4_4_;
        iStack_59b8 = (uint)((byte)(uVar62 >> 2) & 1) * auVar73._8_4_;
        iStack_59b4 = (uint)((byte)(uVar62 >> 3) & 1) * auVar73._12_4_;
        iStack_59b0 = (uint)((byte)(uVar62 >> 4) & 1) * auVar73._16_4_;
        iStack_59ac = (uint)((byte)(uVar62 >> 5) & 1) * auVar73._20_4_;
        iStack_59a8 = (uint)((byte)(uVar62 >> 6) & 1) * auVar73._24_4_;
        iStack_59a4 = (uint)(byte)(uVar62 >> 7) * auVar73._28_4_;
        auVar75 = ZEXT1632(auVar68);
        uVar62 = vcmpps_avx512vl(ZEXT1632(auVar147),auVar75,5);
        auVar73 = vpbroadcastd_avx512vl(ZEXT416(0x40));
        bVar66 = (bool)((byte)uVar62 & 1);
        bVar9 = (bool)((byte)(uVar62 >> 1) & 1);
        bVar10 = (bool)((byte)(uVar62 >> 2) & 1);
        bVar11 = (bool)((byte)(uVar62 >> 3) & 1);
        bVar12 = (bool)((byte)(uVar62 >> 4) & 1);
        bVar13 = (bool)((byte)(uVar62 >> 5) & 1);
        bVar16 = (bool)((byte)(uVar62 >> 6) & 1);
        bVar19 = SUB81(uVar62 >> 7,0);
        local_59a0 = (uint)bVar66 * auVar73._0_4_ | (uint)!bVar66 * 0x60;
        uStack_599c = (uint)bVar9 * auVar73._4_4_ | (uint)!bVar9 * 0x60;
        uStack_5998 = (uint)bVar10 * auVar73._8_4_ | (uint)!bVar10 * 0x60;
        uStack_5994 = (uint)bVar11 * auVar73._12_4_ | (uint)!bVar11 * 0x60;
        uStack_5990 = (uint)bVar12 * auVar73._16_4_ | (uint)!bVar12 * 0x60;
        uStack_598c = (uint)bVar13 * auVar73._20_4_ | (uint)!bVar13 * 0x60;
        uStack_5988 = (uint)bVar16 * auVar73._24_4_ | (uint)!bVar16 * 0x60;
        uStack_5984 = (uint)bVar19 * auVar73._28_4_ | (uint)!bVar19 * 0x60;
        uVar62 = vcmpps_avx512vl(ZEXT1632(auVar72),auVar75,5);
        auVar73 = vpbroadcastd_avx512vl(ZEXT416(0x80));
        bVar66 = (bool)((byte)uVar62 & 1);
        bVar9 = (bool)((byte)(uVar62 >> 1) & 1);
        bVar10 = (bool)((byte)(uVar62 >> 2) & 1);
        bVar11 = (bool)((byte)(uVar62 >> 3) & 1);
        bVar12 = (bool)((byte)(uVar62 >> 4) & 1);
        bVar13 = (bool)((byte)(uVar62 >> 5) & 1);
        bVar16 = (bool)((byte)(uVar62 >> 6) & 1);
        bVar19 = SUB81(uVar62 >> 7,0);
        local_5980 = (uint)bVar66 * auVar73._0_4_ | (uint)!bVar66 * 0xa0;
        uStack_597c = (uint)bVar9 * auVar73._4_4_ | (uint)!bVar9 * 0xa0;
        uStack_5978 = (uint)bVar10 * auVar73._8_4_ | (uint)!bVar10 * 0xa0;
        uStack_5974 = (uint)bVar11 * auVar73._12_4_ | (uint)!bVar11 * 0xa0;
        uStack_5970 = (uint)bVar12 * auVar73._16_4_ | (uint)!bVar12 * 0xa0;
        uStack_596c = (uint)bVar13 * auVar73._20_4_ | (uint)!bVar13 * 0xa0;
        uStack_5968 = (uint)bVar16 * auVar73._24_4_ | (uint)!bVar16 * 0xa0;
        uStack_5964 = (uint)bVar19 * auVar73._28_4_ | (uint)!bVar19 * 0xa0;
        local_4680 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar151 = ZEXT3264(local_4680);
        auVar73 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar75);
        local_5960._0_4_ =
             (uint)(bVar60 & 1) * auVar73._0_4_ | (uint)!(bool)(bVar60 & 1) * local_4680._0_4_;
        bVar66 = (bool)((byte)(uVar67 >> 1) & 1);
        local_5960._4_4_ = (uint)bVar66 * auVar73._4_4_ | (uint)!bVar66 * local_4680._4_4_;
        bVar66 = (bool)((byte)(uVar67 >> 2) & 1);
        local_5960._8_4_ = (uint)bVar66 * auVar73._8_4_ | (uint)!bVar66 * local_4680._8_4_;
        bVar66 = (bool)((byte)(uVar67 >> 3) & 1);
        local_5960._12_4_ = (uint)bVar66 * auVar73._12_4_ | (uint)!bVar66 * local_4680._12_4_;
        bVar66 = (bool)((byte)(uVar67 >> 4) & 1);
        local_5960._16_4_ = (uint)bVar66 * auVar73._16_4_ | (uint)!bVar66 * local_4680._16_4_;
        bVar66 = (bool)((byte)(uVar67 >> 5) & 1);
        local_5960._20_4_ = (uint)bVar66 * auVar73._20_4_ | (uint)!bVar66 * local_4680._20_4_;
        bVar66 = (bool)((byte)(uVar67 >> 6) & 1);
        local_5960._24_4_ = (uint)bVar66 * auVar73._24_4_ | (uint)!bVar66 * local_4680._24_4_;
        bVar66 = SUB81(uVar67 >> 7,0);
        local_5960._28_4_ = (uint)bVar66 * auVar73._28_4_ | (uint)!bVar66 * local_4680._28_4_;
        auVar73 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar150 = ZEXT3264(auVar73);
        local_5ee4 = (int)uVar67;
        auVar75 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),auVar75);
        bVar66 = (bool)((byte)(uVar67 >> 1) & 1);
        bVar9 = (bool)((byte)(uVar67 >> 2) & 1);
        bVar10 = (bool)((byte)(uVar67 >> 3) & 1);
        bVar11 = (bool)((byte)(uVar67 >> 4) & 1);
        bVar12 = (bool)((byte)(uVar67 >> 5) & 1);
        bVar13 = (bool)((byte)(uVar67 >> 6) & 1);
        bVar16 = SUB81(uVar67 >> 7,0);
        local_5940 = (uint)(bVar60 & 1) * auVar75._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar73._0_4_;
        uStack_593c = (uint)bVar66 * auVar75._4_4_ | (uint)!bVar66 * auVar73._4_4_;
        uStack_5938 = (uint)bVar9 * auVar75._8_4_ | (uint)!bVar9 * auVar73._8_4_;
        uStack_5934 = (uint)bVar10 * auVar75._12_4_ | (uint)!bVar10 * auVar73._12_4_;
        uStack_5930 = (uint)bVar11 * auVar75._16_4_ | (uint)!bVar11 * auVar73._16_4_;
        uStack_592c = (uint)bVar12 * auVar75._20_4_ | (uint)!bVar12 * auVar73._20_4_;
        uStack_5928 = (uint)bVar13 * auVar75._24_4_ | (uint)!bVar13 * auVar73._24_4_;
        uStack_5924 = (uint)bVar16 * auVar75._28_4_ | (uint)!bVar16 * auVar73._28_4_;
        local_5dd8 = This;
        local_5de0 = (BVH *)This->ptr;
        local_5fa4 = (uint)(byte)~bVar60;
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar67 = 7;
        }
        else {
          uVar67 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT) * 5 + 2;
        }
        local_5e88 = ray + 0x100;
        puVar61 = local_5800;
        local_5810 = 0xfffffffffffffff8;
        pauVar58 = (undefined1 (*) [32])local_4640;
        local_4660 = local_5960;
        local_5e90 = (undefined1 (*) [32])&local_5c40;
        auVar73 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar152 = ZEXT3264(auVar73);
        auVar68 = vxorps_avx512vl(in_ZMM26._0_16_,in_ZMM26._0_16_);
        auVar154 = ZEXT1664(auVar68);
        local_5ef0 = uVar67;
LAB_01dec6df:
        do {
          auVar73 = auVar150._0_32_;
          auVar77._4_4_ = uStack_593c;
          auVar77._0_4_ = local_5940;
          auVar77._8_4_ = uStack_5938;
          auVar77._12_4_ = uStack_5934;
          auVar77._16_4_ = uStack_5930;
          auVar77._20_4_ = uStack_592c;
          auVar77._24_4_ = uStack_5928;
          auVar77._28_4_ = uStack_5924;
          do {
            root.ptr = puVar61[-1];
            if (root.ptr == 0xfffffffffffffff8) goto LAB_01dedb7b;
            puVar61 = puVar61 + -1;
            _local_5ee0 = pauVar58[-1];
            auVar129 = ZEXT3264(_local_5ee0);
            pauVar58 = pauVar58 + -1;
            uVar62 = vcmpps_avx512vl(_local_5ee0,auVar77,1);
          } while ((char)uVar62 == '\0');
          uVar65 = (undefined4)uVar62;
          if (uVar67 < (uint)POPCOUNT(uVar65)) {
LAB_01dec727:
            do {
              uVar62 = 8;
              auVar73 = auVar150._0_32_;
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_01dedb7b;
                auVar48._4_4_ = uStack_593c;
                auVar48._0_4_ = local_5940;
                auVar48._8_4_ = uStack_5938;
                auVar48._12_4_ = uStack_5934;
                auVar48._16_4_ = uStack_5930;
                auVar48._20_4_ = uStack_592c;
                auVar48._24_4_ = uStack_5928;
                auVar48._28_4_ = uStack_5924;
                uVar20 = vcmpps_avx512vl(auVar129._0_32_,auVar48,9);
                if ((char)uVar20 != '\0') {
                  local_5dd0 = (ulong)((uint)root.ptr & 0xf) - 8;
                  uVar62 = root.ptr & 0xfffffffffffffff0;
                  bVar60 = ~(byte)local_5fa4;
                  lVar55 = 0;
                  while (auVar73 = auVar150._0_32_, lVar55 != local_5dd0) {
                    local_5dc8 = lVar55;
                    lVar55 = lVar55 * 0x90;
                    auVar68._8_8_ = 0;
                    auVar68._0_8_ = *(ulong *)(uVar62 + 0x40 + lVar55);
                    auVar70._8_8_ = 0;
                    auVar70._0_8_ = *(ulong *)(uVar62 + 0x48 + lVar55);
                    uVar56 = vpcmpub_avx512vl(auVar68,auVar70,2);
                    if ((char)uVar56 != '\0') {
                      lVar55 = lVar55 + uVar62;
                      uVar56 = uVar56 & 0xff;
                      local_5e70 = lVar55;
                      do {
                        lVar22 = 0;
                        for (uVar53 = uVar56; (uVar53 & 1) == 0;
                            uVar53 = uVar53 >> 1 | 0x8000000000000000) {
                          lVar22 = lVar22 + 1;
                        }
                        auVar147._8_8_ = 0;
                        auVar147._0_8_ = *(ulong *)(lVar55 + 0x40);
                        auVar73 = vpmovzxbd_avx2(auVar147);
                        auVar73 = vcvtdq2ps_avx(auVar73);
                        uVar65 = *(undefined4 *)(lVar55 + 0x7c);
                        auVar97._4_4_ = uVar65;
                        auVar97._0_4_ = uVar65;
                        auVar97._8_4_ = uVar65;
                        auVar97._12_4_ = uVar65;
                        auVar97._16_4_ = uVar65;
                        auVar97._20_4_ = uVar65;
                        auVar97._24_4_ = uVar65;
                        auVar97._28_4_ = uVar65;
                        uVar65 = *(undefined4 *)(lVar55 + 0x70);
                        auVar104._4_4_ = uVar65;
                        auVar104._0_4_ = uVar65;
                        auVar104._8_4_ = uVar65;
                        auVar104._12_4_ = uVar65;
                        auVar104._16_4_ = uVar65;
                        auVar104._20_4_ = uVar65;
                        auVar104._24_4_ = uVar65;
                        auVar104._28_4_ = uVar65;
                        auVar68 = vfmadd213ps_fma(auVar73,auVar97,auVar104);
                        local_5d20.field_0.x.field_0 =
                             (vfloat_impl<8>)(vfloat_impl<8>)ZEXT1632(auVar68);
                        auVar72._8_8_ = 0;
                        auVar72._0_8_ = *(ulong *)(lVar55 + 0x48);
                        auVar73 = vpmovzxbd_avx2(auVar72);
                        auVar73 = vcvtdq2ps_avx(auVar73);
                        auVar68 = vfmadd213ps_fma(auVar73,auVar97,auVar104);
                        local_5920 = ZEXT1632(auVar68);
                        auVar71._8_8_ = 0;
                        auVar71._0_8_ = *(ulong *)(lVar55 + 0x50);
                        auVar73 = vpmovzxbd_avx2(auVar71);
                        uVar65 = *(undefined4 *)(lVar55 + 0x80);
                        auVar98._4_4_ = uVar65;
                        auVar98._0_4_ = uVar65;
                        auVar98._8_4_ = uVar65;
                        auVar98._12_4_ = uVar65;
                        auVar98._16_4_ = uVar65;
                        auVar98._20_4_ = uVar65;
                        auVar98._24_4_ = uVar65;
                        auVar98._28_4_ = uVar65;
                        auVar73 = vcvtdq2ps_avx(auVar73);
                        uVar65 = *(undefined4 *)(lVar55 + 0x74);
                        auVar105._4_4_ = uVar65;
                        auVar105._0_4_ = uVar65;
                        auVar105._8_4_ = uVar65;
                        auVar105._12_4_ = uVar65;
                        auVar105._16_4_ = uVar65;
                        auVar105._20_4_ = uVar65;
                        auVar105._24_4_ = uVar65;
                        auVar105._28_4_ = uVar65;
                        auVar68 = vfmadd213ps_fma(auVar73,auVar98,auVar105);
                        local_5ba0[0] =
                             (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)ZEXT1632(auVar68);
                        auVar69._8_8_ = 0;
                        auVar69._0_8_ = *(ulong *)(lVar55 + 0x58);
                        auVar73 = vpmovzxbd_avx2(auVar69);
                        auVar73 = vcvtdq2ps_avx(auVar73);
                        auVar68 = vfmadd213ps_fma(auVar73,auVar98,auVar105);
                        auVar73 = ZEXT1632(auVar68);
                        local_5f80.valid = (int *)auVar73._0_8_;
                        local_5f80.geometryUserPtr = (void *)auVar73._8_8_;
                        local_5f80.context = (RTCRayQueryContext *)auVar73._16_8_;
                        local_5f80.ray = (RTCRayN *)auVar73._24_8_;
                        auVar148._8_8_ = 0;
                        auVar148._0_8_ = *(ulong *)(lVar55 + 0x60);
                        auVar73 = vpmovzxbd_avx2(auVar148);
                        uVar65 = *(undefined4 *)(lVar55 + 0x84);
                        auVar99._4_4_ = uVar65;
                        auVar99._0_4_ = uVar65;
                        auVar99._8_4_ = uVar65;
                        auVar99._12_4_ = uVar65;
                        auVar99._16_4_ = uVar65;
                        auVar99._20_4_ = uVar65;
                        auVar99._24_4_ = uVar65;
                        auVar99._28_4_ = uVar65;
                        uVar65 = *(undefined4 *)(lVar55 + 0x78);
                        auVar106._4_4_ = uVar65;
                        auVar106._0_4_ = uVar65;
                        auVar106._8_4_ = uVar65;
                        auVar106._12_4_ = uVar65;
                        auVar106._16_4_ = uVar65;
                        auVar106._20_4_ = uVar65;
                        auVar106._24_4_ = uVar65;
                        auVar106._28_4_ = uVar65;
                        auVar73 = vcvtdq2ps_avx(auVar73);
                        auVar68 = vfmadd213ps_fma(auVar73,auVar99,auVar106);
                        local_5e40 = ZEXT1632(auVar68);
                        auVar153._8_8_ = 0;
                        auVar153._0_8_ = *(ulong *)(lVar55 + 0x68);
                        auVar73 = vpmovzxbd_avx2(auVar153);
                        auVar73 = vcvtdq2ps_avx(auVar73);
                        auVar68 = vfmadd213ps_fma(auVar73,auVar99,auVar106);
                        local_5dc0 = ZEXT1632(auVar68);
                        auVar45._4_4_ = fStack_5a1c;
                        auVar45._0_4_ = local_5a20;
                        auVar45._8_4_ = fStack_5a18;
                        auVar45._12_4_ = fStack_5a14;
                        auVar45._16_4_ = fStack_5a10;
                        auVar45._20_4_ = fStack_5a0c;
                        auVar45._24_4_ = fStack_5a08;
                        auVar45._28_4_ = uStack_5a04;
                        uVar53 = (ulong)(uint)((int)lVar22 * 4);
                        uVar65 = *(undefined4 *)((long)&local_5d20 + uVar53);
                        auVar112._4_4_ = uVar65;
                        auVar112._0_4_ = uVar65;
                        auVar112._8_4_ = uVar65;
                        auVar112._12_4_ = uVar65;
                        auVar112._16_4_ = uVar65;
                        auVar112._20_4_ = uVar65;
                        auVar112._24_4_ = uVar65;
                        auVar112._28_4_ = uVar65;
                        auVar68 = vfmsub132ps_fma(auVar112,auVar45,local_5a80);
                        auVar46._4_4_ = fStack_59fc;
                        auVar46._0_4_ = local_5a00;
                        auVar46._8_4_ = fStack_59f8;
                        auVar46._12_4_ = fStack_59f4;
                        auVar46._16_4_ = fStack_59f0;
                        auVar46._20_4_ = fStack_59ec;
                        auVar46._24_4_ = fStack_59e8;
                        auVar46._28_4_ = uStack_59e4;
                        uVar65 = *(undefined4 *)((long)local_5ba0 + uVar53);
                        auVar120._4_4_ = uVar65;
                        auVar120._0_4_ = uVar65;
                        auVar120._8_4_ = uVar65;
                        auVar120._12_4_ = uVar65;
                        auVar120._16_4_ = uVar65;
                        auVar120._20_4_ = uVar65;
                        auVar120._24_4_ = uVar65;
                        auVar120._28_4_ = uVar65;
                        uVar65 = *(undefined4 *)(local_5e40 + uVar53);
                        auVar123._4_4_ = uVar65;
                        auVar123._0_4_ = uVar65;
                        auVar123._8_4_ = uVar65;
                        auVar123._12_4_ = uVar65;
                        auVar123._16_4_ = uVar65;
                        auVar123._20_4_ = uVar65;
                        auVar123._24_4_ = uVar65;
                        auVar123._28_4_ = uVar65;
                        auVar70 = vfmsub132ps_fma(auVar120,auVar46,local_5a60);
                        auVar147 = vfmsub132ps_fma(auVar123,local_59e0,local_5a40);
                        uVar65 = *(undefined4 *)(local_5920 + uVar53);
                        auVar23._4_4_ = uVar65;
                        auVar23._0_4_ = uVar65;
                        auVar23._8_4_ = uVar65;
                        auVar23._12_4_ = uVar65;
                        auVar23._16_4_ = uVar65;
                        auVar23._20_4_ = uVar65;
                        auVar23._24_4_ = uVar65;
                        auVar23._28_4_ = uVar65;
                        auVar78 = vfmsub132ps_avx512vl(local_5a80,auVar45,auVar23);
                        uVar65 = *(undefined4 *)((long)&local_5f80.valid + uVar53);
                        auVar24._4_4_ = uVar65;
                        auVar24._0_4_ = uVar65;
                        auVar24._8_4_ = uVar65;
                        auVar24._12_4_ = uVar65;
                        auVar24._16_4_ = uVar65;
                        auVar24._20_4_ = uVar65;
                        auVar24._24_4_ = uVar65;
                        auVar24._28_4_ = uVar65;
                        auVar74 = vfmsub132ps_avx512vl(local_5a60,auVar46,auVar24);
                        uVar65 = *(undefined4 *)(local_5dc0 + uVar53);
                        auVar25._4_4_ = uVar65;
                        auVar25._0_4_ = uVar65;
                        auVar25._8_4_ = uVar65;
                        auVar25._12_4_ = uVar65;
                        auVar25._16_4_ = uVar65;
                        auVar25._20_4_ = uVar65;
                        auVar25._24_4_ = uVar65;
                        auVar25._28_4_ = uVar65;
                        auVar76 = vfmsub132ps_avx512vl(local_5a40,local_59e0,auVar25);
                        auVar73 = vpminsd_avx2(ZEXT1632(auVar68),auVar78);
                        auVar75 = vpminsd_avx2(ZEXT1632(auVar70),auVar74);
                        auVar73 = vpmaxsd_avx2(auVar73,auVar75);
                        auVar75 = vpminsd_avx2(ZEXT1632(auVar147),auVar76);
                        auVar73 = vpmaxsd_avx2(auVar73,auVar75);
                        auVar75 = vpmaxsd_avx2(ZEXT1632(auVar68),auVar78);
                        auVar78 = vpmaxsd_avx2(ZEXT1632(auVar70),auVar74);
                        auVar78 = vpminsd_avx2(auVar75,auVar78);
                        auVar75 = vpmaxsd_avx2(ZEXT1632(auVar147),auVar76);
                        auVar75 = vpminsd_avx2(auVar78,auVar75);
                        auVar73 = vpmaxsd_avx2(auVar73,local_5960);
                        auVar49._4_4_ = uStack_593c;
                        auVar49._0_4_ = local_5940;
                        auVar49._8_4_ = uStack_5938;
                        auVar49._12_4_ = uStack_5934;
                        auVar49._16_4_ = uStack_5930;
                        auVar49._20_4_ = uStack_592c;
                        auVar49._24_4_ = uStack_5928;
                        auVar49._28_4_ = uStack_5924;
                        auVar75 = vpminsd_avx2(auVar75,auVar49);
                        uVar20 = vpcmpd_avx512vl(auVar73,auVar75,2);
                        if ((bVar60 & (byte)uVar20) == 0) {
                          bVar66 = false;
                        }
                        else {
                          local_5e68 = uVar56;
                          uVar4 = *(ushort *)(lVar55 + lVar22 * 8);
                          uVar5 = *(ushort *)(lVar55 + 2 + lVar22 * 8);
                          pGVar6 = (context->scene->geometries).items[*(uint *)(lVar55 + 0x88)].ptr;
                          local_5e78 = *(long *)&pGVar6->field_0x58;
                          local_5e80 = (ulong)*(uint *)(lVar55 + 4 + lVar22 * 8) *
                                       pGVar6[1].super_RefCount.refCounter.
                                       super___atomic_base<unsigned_long>._M_i;
                          lVar22 = *(long *)&pGVar6[1].time_range.upper;
                          local_5f84 = uVar4 & 0x7fff;
                          local_5f88 = uVar5 & 0x7fff;
                          uVar119 = *(uint *)(local_5e78 + 4 + local_5e80);
                          uVar67 = (ulong)uVar119;
                          uVar53 = (ulong)(uVar119 * local_5f88 +
                                          *(int *)(local_5e78 + local_5e80) + local_5f84);
                          p_Var7 = pGVar6[1].intersectionFilterN;
                          puVar1 = (undefined8 *)(lVar22 + (uVar53 + 1) * (long)p_Var7);
                          local_5920._16_8_ = *puVar1;
                          local_5920._24_8_ = puVar1[1];
                          lVar55 = uVar53 + uVar67;
                          local_58f0 = *(undefined1 (*) [16])(lVar22 + lVar55 * (long)p_Var7);
                          lVar63 = uVar53 + uVar67 + 1;
                          puVar1 = (undefined8 *)(lVar22 + lVar63 * (long)p_Var7);
                          local_5900 = *puVar1;
                          uStack_58f8 = puVar1[1];
                          auVar68 = vpbroadcastd_avx512vl();
                          auVar129 = ZEXT1664(auVar68);
                          uVar56 = (ulong)(-1 < (short)uVar4);
                          lVar59 = uVar56 + lVar63;
                          puVar1 = (undefined8 *)(lVar22 + lVar59 * (long)p_Var7);
                          local_58c0 = *puVar1;
                          uStack_58b8 = puVar1[1];
                          if ((short)uVar5 < 0) {
                            uVar67 = 0;
                          }
                          puVar1 = (undefined8 *)(lVar22 + (lVar63 + uVar67) * (long)p_Var7);
                          local_5880 = *puVar1;
                          uStack_5878 = puVar1[1];
                          local_5920._0_16_ = *(undefined1 (*) [16])(lVar22 + (long)p_Var7 * uVar53)
                          ;
                          local_58e0 = local_5920._16_8_;
                          uStack_58d8 = local_5920._24_8_;
                          local_58d0 = *(undefined1 (*) [16])
                                        (lVar22 + (uVar53 + uVar56 + 1) * (long)p_Var7);
                          local_58b0 = local_5900;
                          uStack_58a8 = uStack_58f8;
                          local_58a0 = local_58f0;
                          local_5890 = local_5900;
                          uStack_5888 = uStack_58f8;
                          local_5870 = *(undefined1 (*) [16])
                                        (lVar22 + (lVar55 + uVar67) * (long)p_Var7);
                          local_5860 = local_5900;
                          uStack_5858 = uStack_58f8;
                          local_5850 = local_58c0;
                          uStack_5848 = uStack_58b8;
                          local_5840 = *(undefined1 (*) [16])
                                        (lVar22 + (uVar67 + lVar59) * (long)p_Var7);
                          local_5830 = local_5880;
                          uStack_5828 = uStack_5878;
                          auVar68 = vpbroadcastd_avx512vl();
                          auVar155 = ZEXT1664(auVar68);
                          pfVar64 = (float *)(local_58f0 + 8);
                          uVar67 = 0;
                          bVar57 = bVar60;
                          do {
                            auVar68 = auVar154._0_16_;
                            if (uVar67 == 4) goto LAB_01ded9f5;
                            fVar91 = pfVar64[-0xe];
                            auVar100._4_4_ = fVar91;
                            auVar100._0_4_ = fVar91;
                            auVar100._8_4_ = fVar91;
                            auVar100._12_4_ = fVar91;
                            auVar100._16_4_ = fVar91;
                            auVar100._20_4_ = fVar91;
                            auVar100._24_4_ = fVar91;
                            auVar100._28_4_ = fVar91;
                            fVar94 = pfVar64[-0xd];
                            auVar117._4_4_ = fVar94;
                            auVar117._0_4_ = fVar94;
                            auVar117._8_4_ = fVar94;
                            auVar117._12_4_ = fVar94;
                            auVar117._16_4_ = fVar94;
                            auVar117._20_4_ = fVar94;
                            auVar117._24_4_ = fVar94;
                            auVar117._28_4_ = fVar94;
                            fVar95 = pfVar64[-0xc];
                            auVar126._4_4_ = fVar95;
                            auVar126._0_4_ = fVar95;
                            auVar126._8_4_ = fVar95;
                            auVar126._12_4_ = fVar95;
                            auVar126._16_4_ = fVar95;
                            auVar126._20_4_ = fVar95;
                            auVar126._24_4_ = fVar95;
                            auVar126._28_4_ = fVar95;
                            local_5f20 = pfVar64[-10];
                            local_5ee0._4_4_ = pfVar64[-9];
                            local_5ec0._4_4_ = pfVar64[-8];
                            auVar79 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar64[-6]));
                            auVar80 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar64[-5]));
                            auVar81 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar64[-4]));
                            local_5e60 = pfVar64[-2];
                            local_5e00 = pfVar64[-1];
                            local_5e20 = *pfVar64;
                            local_5d90 = vmovdqa64_avx512vl(auVar155._0_16_);
                            local_5da0 = vmovdqa64_avx512vl(auVar129._0_16_);
                            fStack_5f1c = local_5f20;
                            fStack_5f18 = local_5f20;
                            fStack_5f14 = local_5f20;
                            fStack_5f10 = local_5f20;
                            fStack_5f0c = local_5f20;
                            fStack_5f08 = local_5f20;
                            fStack_5f04 = local_5f20;
                            fVar137 = fVar91 - local_5f20;
                            auVar130._4_4_ = fVar137;
                            auVar130._0_4_ = fVar137;
                            auVar130._8_4_ = fVar137;
                            auVar130._12_4_ = fVar137;
                            auVar130._16_4_ = fVar137;
                            auVar130._20_4_ = fVar137;
                            auVar130._24_4_ = fVar137;
                            auVar130._28_4_ = fVar137;
                            local_5ee0._0_4_ = local_5ee0._4_4_;
                            fStack_5ed8 = (float)local_5ee0._4_4_;
                            fStack_5ed4 = (float)local_5ee0._4_4_;
                            fStack_5ed0 = (float)local_5ee0._4_4_;
                            fStack_5ecc = (float)local_5ee0._4_4_;
                            fStack_5ec8 = (float)local_5ee0._4_4_;
                            fStack_5ec4 = (float)local_5ee0._4_4_;
                            fVar96 = fVar94 - (float)local_5ee0._4_4_;
                            auVar135._4_4_ = fVar96;
                            auVar135._0_4_ = fVar96;
                            auVar135._8_4_ = fVar96;
                            auVar135._12_4_ = fVar96;
                            auVar135._16_4_ = fVar96;
                            auVar135._20_4_ = fVar96;
                            auVar135._24_4_ = fVar96;
                            auVar135._28_4_ = fVar96;
                            local_5ec0._0_4_ = local_5ec0._4_4_;
                            fStack_5eb8 = (float)local_5ec0._4_4_;
                            fStack_5eb4 = (float)local_5ec0._4_4_;
                            fStack_5eb0 = (float)local_5ec0._4_4_;
                            fStack_5eac = (float)local_5ec0._4_4_;
                            fStack_5ea8 = (float)local_5ec0._4_4_;
                            fStack_5ea4 = (float)local_5ec0._4_4_;
                            fVar136 = fVar95 - (float)local_5ec0._4_4_;
                            auVar141._4_4_ = fVar136;
                            auVar141._0_4_ = fVar136;
                            auVar141._8_4_ = fVar136;
                            auVar141._12_4_ = fVar136;
                            auVar141._16_4_ = fVar136;
                            auVar141._20_4_ = fVar136;
                            auVar141._24_4_ = fVar136;
                            auVar141._28_4_ = fVar136;
                            auVar143 = ZEXT436((uint)fVar136);
                            fStack_5e5c = local_5e60;
                            fStack_5e58 = local_5e60;
                            fStack_5e54 = local_5e60;
                            fStack_5e50 = local_5e60;
                            fStack_5e4c = local_5e60;
                            fStack_5e48 = local_5e60;
                            fStack_5e44 = local_5e60;
                            auVar82 = vbroadcastss_avx512vl(ZEXT416((uint)(local_5e60 - fVar91)));
                            fStack_5dfc = local_5e00;
                            fStack_5df8 = local_5e00;
                            fStack_5df4 = local_5e00;
                            fStack_5df0 = local_5e00;
                            fStack_5dec = local_5e00;
                            fStack_5de8 = local_5e00;
                            fStack_5de4 = local_5e00;
                            auVar83 = vbroadcastss_avx512vl(ZEXT416((uint)(local_5e00 - fVar94)));
                            fStack_5e1c = local_5e20;
                            fStack_5e18 = local_5e20;
                            fStack_5e14 = local_5e20;
                            fStack_5e10 = local_5e20;
                            fStack_5e0c = local_5e20;
                            fStack_5e08 = local_5e20;
                            fStack_5e04 = local_5e20;
                            auVar84 = vbroadcastss_avx512vl(ZEXT416((uint)(local_5e20 - fVar95)));
                            auVar72 = auVar84._0_16_;
                            fVar96 = fVar96 * (local_5e20 - fVar95);
                            auVar121._4_4_ = fVar96;
                            auVar121._0_4_ = fVar96;
                            auVar121._8_4_ = fVar96;
                            auVar121._12_4_ = fVar96;
                            auVar121._16_4_ = fVar96;
                            auVar121._20_4_ = fVar96;
                            auVar121._24_4_ = fVar96;
                            auVar121._28_4_ = fVar96;
                            vVar85.field_0 =
                                 (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)
                                 vfmsub231ps_avx512vl(auVar121,auVar83,auVar141);
                            fVar136 = fVar136 * (local_5e60 - fVar91);
                            auVar122._4_4_ = fVar136;
                            auVar122._0_4_ = fVar136;
                            auVar122._8_4_ = fVar136;
                            auVar122._12_4_ = fVar136;
                            auVar122._16_4_ = fVar136;
                            auVar122._20_4_ = fVar136;
                            auVar122._24_4_ = fVar136;
                            auVar122._28_4_ = fVar136;
                            local_5d20.field_0.y.field_0 =
                                 (vfloat_impl<8>)vfmsub231ps_avx512vl(auVar122,auVar84,auVar130);
                            fVar137 = (local_5e00 - fVar94) * fVar137;
                            auVar124._4_4_ = fVar137;
                            auVar124._0_4_ = fVar137;
                            auVar124._8_4_ = fVar137;
                            auVar124._12_4_ = fVar137;
                            auVar124._16_4_ = fVar137;
                            auVar124._20_4_ = fVar137;
                            auVar124._24_4_ = fVar137;
                            auVar124._28_4_ = fVar137;
                            auVar73 = *(undefined1 (*) [32])ray;
                            auVar110 = ZEXT3264(*(undefined1 (*) [32])(ray + 0x20));
                            auVar116 = ZEXT3264(*(undefined1 (*) [32])(ray + 0x40));
                            auVar75 = *(undefined1 (*) [32])(ray + 0x80);
                            local_5d20.field_0.z.field_0 =
                                 (vfloat_impl<8>)vfmsub231ps_avx512vl(auVar124,auVar82,auVar135);
                            auVar76 = vsubps_avx(auVar100,auVar73);
                            auVar77 = vsubps_avx(auVar117,*(undefined1 (*) [32])(ray + 0x20));
                            auVar89 = vsubps_avx(auVar126,*(undefined1 (*) [32])(ray + 0x40));
                            uVar119 = auVar89._28_4_;
                            auVar146 = ZEXT436(uVar119);
                            auVar145 = ZEXT436(uVar119);
                            auVar78 = *(undefined1 (*) [32])(ray + 0xa0);
                            auVar74 = *(undefined1 (*) [32])(ray + 0xc0);
                            auVar86 = vmulps_avx512vl(auVar78,auVar89);
                            auVar86 = vfmsub231ps_avx512vl(auVar86,auVar77,auVar74);
                            auVar87 = vmulps_avx512vl(auVar74,auVar76);
                            auVar87 = vfmsub231ps_avx512vl(auVar87,auVar89,auVar75);
                            auVar70 = auVar87._0_16_;
                            auVar88 = vmulps_avx512vl(auVar75,auVar77);
                            auVar88 = vfmsub231ps_avx512vl(auVar88,auVar76,auVar78);
                            auVar147 = auVar88._0_16_;
                            auVar84 = vmulps_avx512vl(auVar84,auVar88);
                            auVar83 = vfmadd231ps_avx512vl(auVar84,auVar87,auVar83);
                            auVar84 = vmulps_avx512vl((undefined1  [32])local_5d20.field_0.z.field_0
                                                      ,auVar74);
                            auVar84 = vfmadd231ps_avx512vl
                                                (auVar84,(undefined1  [32])
                                                         local_5d20.field_0.y.field_0,auVar78);
                            auVar84 = vfmadd231ps_avx512vl
                                                (auVar84,(undefined1  [32])vVar85.field_0,auVar75);
                            auVar82 = vfmadd231ps_avx512vl(auVar83,auVar86,auVar82);
                            vandps_avx512vl(auVar84,auVar152._0_32_);
                            auVar83 = vxorps_avx512vl(auVar82,auVar82);
                            uVar20 = vcmpps_avx512vl(auVar83,auVar154._0_32_,5);
                            bVar51 = (byte)uVar20 & bVar57;
                            if (bVar51 != 0) {
                              auVar88 = vmulps_avx512vl(auVar141,auVar88);
                              auVar143 = ZEXT436(auVar88._28_4_);
                              auVar87 = vfmadd213ps_avx512vl(auVar87,auVar135,auVar88);
                              auVar70 = auVar87._0_16_;
                              auVar86 = vfmadd213ps_avx512vl(auVar86,auVar130,auVar87);
                              auVar87 = vxorps_avx512vl(auVar82,auVar86);
                              uVar20 = vcmpps_avx512vl(auVar87,auVar154._0_32_,5);
                              bVar51 = bVar51 & (byte)uVar20;
                              if (bVar51 != 0) {
                                vandps_avx512vl(auVar84,auVar149._0_32_);
                                auVar88 = vsubps_avx(auVar87,auVar83);
                                uVar3 = auVar88._28_4_;
                                auVar143 = ZEXT436(uVar3);
                                uVar20 = vcmpps_avx512vl(auVar88,auVar87,5);
                                bVar51 = bVar51 & (byte)uVar20;
                                if (bVar51 != 0) {
                                  local_5d80 = auVar81;
                                  local_5d60 = auVar80;
                                  local_5d40 = auVar79;
                                  local_5f40 = vmovdqa64_avx512vl(auVar155._0_16_);
                                  local_5f30 = vmovdqa64_avx512vl(auVar129._0_16_);
                                  auVar69 = vxorps_avx512vl(auVar86._0_16_,auVar86._0_16_);
                                  auVar28._4_4_ = local_5d20._68_4_ * auVar89._4_4_;
                                  auVar28._0_4_ = local_5d20._64_4_ * auVar89._0_4_;
                                  auVar28._8_4_ = local_5d20._72_4_ * auVar89._8_4_;
                                  auVar28._12_4_ = local_5d20._76_4_ * auVar89._12_4_;
                                  auVar28._16_4_ = local_5d20._80_4_ * auVar89._16_4_;
                                  auVar28._20_4_ = local_5d20._84_4_ * auVar89._20_4_;
                                  auVar28._24_4_ = local_5d20._88_4_ * auVar89._24_4_;
                                  auVar28._28_4_ = uVar3;
                                  auVar71 = vfmadd213ps_fma(auVar77,(undefined1  [32])
                                                                    local_5d20.field_0.y.field_0,
                                                            auVar28);
                                  auVar71 = vfmadd213ps_fma(auVar76,(undefined1  [32])vVar85.field_0
                                                            ,ZEXT1632(auVar71));
                                  fVar91 = auVar87._0_4_;
                                  auVar139._0_4_ = fVar91 * *(float *)(ray + 0x60);
                                  fVar94 = auVar87._4_4_;
                                  auVar139._4_4_ = fVar94 * *(float *)(ray + 100);
                                  fVar95 = auVar87._8_4_;
                                  auVar139._8_4_ = fVar95 * *(float *)(ray + 0x68);
                                  fVar96 = auVar87._12_4_;
                                  auVar139._12_4_ = fVar96 * *(float *)(ray + 0x6c);
                                  fVar136 = auVar87._16_4_;
                                  auVar139._16_4_ = fVar136 * *(float *)(ray + 0x70);
                                  fVar137 = auVar87._20_4_;
                                  auVar139._20_4_ = fVar137 * *(float *)(ray + 0x74);
                                  fVar138 = auVar87._24_4_;
                                  auVar139._24_4_ = fVar138 * *(float *)(ray + 0x78);
                                  auVar139._28_4_ = 0;
                                  auVar76 = vxorps_avx512vl(auVar82,ZEXT1632(auVar71));
                                  auVar29._4_4_ = fVar94 * *(float *)(ray + 0x104);
                                  auVar29._0_4_ = fVar91 * *(float *)(ray + 0x100);
                                  auVar29._8_4_ = fVar95 * *(float *)(ray + 0x108);
                                  auVar29._12_4_ = fVar96 * *(float *)(ray + 0x10c);
                                  auVar29._16_4_ = fVar136 * *(float *)(ray + 0x110);
                                  auVar29._20_4_ = fVar137 * *(float *)(ray + 0x114);
                                  auVar29._24_4_ = fVar138 * *(float *)(ray + 0x118);
                                  auVar29._28_4_ = uVar3;
                                  auVar143 = ZEXT436(uVar3);
                                  uVar20 = vcmpps_avx512vl(auVar76,auVar29,2);
                                  uVar21 = vcmpps_avx512vl(auVar139,auVar76,1);
                                  bVar51 = bVar51 & (byte)uVar20 & (byte)uVar21;
                                  if (bVar51 == 0) {
LAB_01ded2b8:
                                    auVar79 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                    auVar89 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                    auVar77 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                    auVar76 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                    auVar71 = vxorps_avx512vl(auVar68,auVar68);
                                    auVar68 = vmovdqa64_avx512vl(local_5f30);
                                    auVar145 = ZEXT436(uVar119);
                                  }
                                  else {
                                    uVar20 = vcmpps_avx512vl(auVar84,ZEXT1632(auVar69),4);
                                    bVar51 = bVar51 & (byte)uVar20;
                                    if (bVar51 == 0) goto LAB_01ded2b8;
                                    local_5c00._0_8_ =
                                         CONCAT44(0,*(uint *)(local_5d90 + uVar67 * 4));
                                    local_5ef8 = (context->scene->geometries).items
                                                 [CONCAT44(0,*(uint *)(local_5d90 + uVar67 * 4))].
                                                 ptr;
                                    uVar2 = local_5ef8->mask;
                                    auVar140._4_4_ = uVar2;
                                    auVar140._0_4_ = uVar2;
                                    auVar140._8_4_ = uVar2;
                                    auVar140._12_4_ = uVar2;
                                    auVar140._16_4_ = uVar2;
                                    auVar140._20_4_ = uVar2;
                                    auVar140._24_4_ = uVar2;
                                    auVar140._28_4_ = uVar2;
                                    uVar20 = vptestmd_avx512vl(auVar140,*(undefined1 (*) [32])
                                                                         (ray + 0x120));
                                    local_5f90._0_1_ = (byte)uVar20 & bVar51;
                                    if ((byte)local_5f90 == 0) goto LAB_01ded2b8;
                                    local_5ee8 = *(undefined4 *)(local_5da0 + uVar67 * 4);
                                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                       (auVar143 = ZEXT436(uVar3),
                                       local_5ef8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                      auVar148 = auVar149._0_16_;
                                      auVar71 = vcvtsi2ss_avx512f(auVar148,*(ushort *)
                                                                            (local_5e78 + 8 +
                                                                            local_5e80) - 1);
                                      auVar33._12_4_ = 0;
                                      auVar33._0_12_ = ZEXT812(0);
                                      auVar69 = vrcp14ss_avx512f(auVar33 << 0x20,
                                                                 ZEXT416(auVar71._0_4_));
                                      auVar71 = vfnmadd213ss_fma(auVar71,auVar69,
                                                                 SUB6416(ZEXT464(0x40000000),0));
                                      fVar90 = auVar69._0_4_ * auVar71._0_4_;
                                      auVar71 = vcvtsi2ss_avx512f(auVar148,*(ushort *)
                                                                            (local_5e78 + 10 +
                                                                            local_5e80) - 1);
                                      auVar69 = vrcp14ss_avx512f(auVar33 << 0x20,
                                                                 ZEXT416(auVar71._0_4_));
                                      auVar71 = vfnmadd213ss_fma(auVar71,auVar69,
                                                                 SUB6416(ZEXT464(0x40000000),0));
                                      fStack_5c64 = auVar69._0_4_ * auVar71._0_4_;
                                      auVar71 = vcvtsi2ss_avx512f(auVar148,((uint)uVar67 & 1) +
                                                                           local_5f84);
                                      fVar103 = auVar71._0_4_;
                                      auVar108._0_4_ = auVar83._0_4_ + fVar91 * fVar103;
                                      auVar108._4_4_ = auVar83._4_4_ + fVar94 * fVar103;
                                      auVar108._8_4_ = auVar83._8_4_ + fVar95 * fVar103;
                                      auVar108._12_4_ = auVar83._12_4_ + fVar96 * fVar103;
                                      auVar108._16_4_ = auVar83._16_4_ + fVar136 * fVar103;
                                      auVar108._20_4_ = auVar83._20_4_ + fVar137 * fVar103;
                                      auVar108._24_4_ = auVar83._24_4_ + fVar138 * fVar103;
                                      auVar108._28_4_ = auVar83._28_4_ + fVar103;
                                      auVar92._4_4_ = fVar90;
                                      auVar92._0_4_ = fVar90;
                                      auVar92._8_4_ = fVar90;
                                      auVar92._12_4_ = fVar90;
                                      auVar92._16_4_ = fVar90;
                                      auVar92._20_4_ = fVar90;
                                      auVar92._24_4_ = fVar90;
                                      auVar92._28_4_ = fVar90;
                                      auVar73 = vmulps_avx512vl(auVar108,auVar92);
                                      bVar66 = (bool)(bVar51 >> 1 & 1);
                                      bVar10 = (bool)(bVar51 >> 2 & 1);
                                      bVar12 = (bool)(bVar51 >> 3 & 1);
                                      bVar16 = (bool)(bVar51 >> 4 & 1);
                                      bVar14 = (bool)(bVar51 >> 5 & 1);
                                      bVar17 = (bool)(bVar51 >> 6 & 1);
                                      auVar71 = vcvtsi2ss_avx512f(auVar148,((uint)(uVar67 >> 1) &
                                                                           0x7fffffff) + local_5f88)
                                      ;
                                      fVar90 = auVar71._0_4_;
                                      auVar93._0_4_ = fVar91 + fVar91 * fVar90;
                                      auVar93._4_4_ = fVar94 + fVar94 * fVar90;
                                      auVar93._8_4_ = fVar95 + fVar95 * fVar90;
                                      auVar93._12_4_ = fVar96 + fVar96 * fVar90;
                                      auVar93._16_4_ = fVar136 + fVar136 * fVar90;
                                      auVar93._20_4_ = fVar137 + fVar137 * fVar90;
                                      auVar93._24_4_ = fVar138 + fVar138 * fVar90;
                                      auVar93._28_4_ = auVar87._28_4_ + fVar90;
                                      auVar102._4_4_ = fStack_5c64;
                                      auVar102._0_4_ = fStack_5c64;
                                      auVar102._8_4_ = fStack_5c64;
                                      auVar102._12_4_ = fStack_5c64;
                                      auVar102._16_4_ = fStack_5c64;
                                      auVar102._20_4_ = fStack_5c64;
                                      auVar102._24_4_ = fStack_5c64;
                                      auVar102._28_4_ = fStack_5c64;
                                      auVar75 = vmulps_avx512vl(auVar93,auVar102);
                                      bVar9 = (bool)(bVar51 >> 1 & 1);
                                      bVar11 = (bool)(bVar51 >> 2 & 1);
                                      bVar13 = (bool)(bVar51 >> 3 & 1);
                                      bVar19 = (bool)(bVar51 >> 4 & 1);
                                      bVar15 = (bool)(bVar51 >> 5 & 1);
                                      bVar18 = (bool)(bVar51 >> 6 & 1);
                                      auVar78 = vrcp14ps_avx512vl(auVar87);
                                      auVar27._8_4_ = 0x3f800000;
                                      auVar27._0_8_ = 0x3f8000003f800000;
                                      auVar27._12_4_ = 0x3f800000;
                                      auVar27._16_4_ = 0x3f800000;
                                      auVar27._20_4_ = 0x3f800000;
                                      auVar27._24_4_ = 0x3f800000;
                                      auVar27._28_4_ = 0x3f800000;
                                      auVar74 = vfnmadd213ps_avx512vl(auVar87,auVar78,auVar27);
                                      auVar71 = vfmadd132ps_fma(auVar74,auVar78,auVar78);
                                      fVar90 = auVar71._0_4_;
                                      fVar103 = auVar71._4_4_;
                                      fVar125 = auVar71._8_4_;
                                      fVar131 = auVar71._12_4_;
                                      local_5cc0 = CONCAT44(fVar103 * auVar76._4_4_,
                                                            fVar90 * auVar76._0_4_);
                                      uStack_5cb8 = CONCAT44(fVar131 * auVar76._12_4_,
                                                             fVar125 * auVar76._8_4_);
                                      uStack_5cb0 = CONCAT44(auVar76._20_4_ * 0.0,
                                                             auVar76._16_4_ * 0.0);
                                      uStack_5ca8 = CONCAT44(auVar78._28_4_,auVar76._24_4_ * 0.0);
                                      local_5ca0._4_4_ =
                                           (float)((uint)bVar9 * auVar75._4_4_ |
                                                  (uint)!bVar9 * (int)fVar94) * fVar103;
                                      local_5ca0._0_4_ =
                                           (float)((uint)(bVar51 & 1) * auVar75._0_4_ |
                                                  (uint)!(bool)(bVar51 & 1) * (int)fVar91) * fVar90;
                                      fStack_5c98 = (float)((uint)bVar11 * auVar75._8_4_ |
                                                           (uint)!bVar11 * (int)fVar95) * fVar125;
                                      fStack_5c94 = (float)((uint)bVar13 * auVar75._12_4_ |
                                                           (uint)!bVar13 * (int)fVar96) * fVar131;
                                      fStack_5c90 = (float)((uint)bVar19 * auVar75._16_4_ |
                                                           (uint)!bVar19 * (int)fVar136) * 0.0;
                                      fStack_5c8c = (float)((uint)bVar15 * auVar75._20_4_ |
                                                           (uint)!bVar15 * (int)fVar137) * 0.0;
                                      fStack_5c88 = (float)((uint)bVar18 * auVar75._24_4_ |
                                                           (uint)!bVar18 * (int)fVar138) * 0.0;
                                      fStack_5c84 = auVar108._28_4_;
                                      local_5c80._4_4_ =
                                           (float)((uint)bVar66 * auVar73._4_4_ |
                                                  (uint)!bVar66 * (int)auVar83._4_4_) * fVar103;
                                      local_5c80._0_4_ =
                                           (float)((uint)(bVar51 & 1) * auVar73._0_4_ |
                                                  (uint)!(bool)(bVar51 & 1) * (int)auVar83._0_4_) *
                                           fVar90;
                                      fStack_5c78 = (float)((uint)bVar10 * auVar73._8_4_ |
                                                           (uint)!bVar10 * (int)auVar83._8_4_) *
                                                    fVar125;
                                      fStack_5c74 = (float)((uint)bVar12 * auVar73._12_4_ |
                                                           (uint)!bVar12 * (int)auVar83._12_4_) *
                                                    fVar131;
                                      fStack_5c70 = (float)((uint)bVar16 * auVar73._16_4_ |
                                                           (uint)!bVar16 * (int)auVar83._16_4_) *
                                                    0.0;
                                      fStack_5c6c = (float)((uint)bVar14 * auVar73._20_4_ |
                                                           (uint)!bVar14 * (int)auVar83._20_4_) *
                                                    0.0;
                                      fStack_5c68 = (float)((uint)bVar17 * auVar73._24_4_ |
                                                           (uint)!bVar17 * (int)auVar83._24_4_) *
                                                    0.0;
                                      local_5f80.geometryUserPtr = local_5be0;
                                      local_5f80.valid = (int *)local_5ba0;
                                      local_5f80.context = (RTCRayQueryContext *)local_5bc0;
                                      local_5f80.ray = (RTCRayN *)local_5dc0;
                                      auVar143 = (undefined1  [36])0x0;
                                      auVar146 = (undefined1  [36])0x0;
                                      local_5d20.field_0.x.field_0 =
                                           (vfloat_impl<8>)(undefined1  [32])vVar85.field_0;
                                      std::
                                      _Tuple_impl<0ul,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::Vec3<embree::vfloat_impl<8>>&>
                                      ::
                                      _M_assign<embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::Vec3<embree::vfloat_impl<8>>>
                                                ((_Tuple_impl<0UL,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::Vec3<embree::vfloat_impl<8>_>_&>
                                                  *)&local_5f80,
                                                 (_Tuple_impl<0UL,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::Vec3<embree::vfloat_impl<8>_>_>
                                                  *)&local_5d20.field_0);
                                      pRVar8 = context->user;
                                      local_5c60 = vpbroadcastd_avx512vl();
                                      _local_5c80 = vpbroadcastd_avx512vl();
                                      local_5d20.field_0.x.field_0 =
                                           (vfloat_impl<8>)(vfloat_impl<8>)local_5ba0[0];
                                      local_5cc0 = local_5dc0._0_8_;
                                      uStack_5cb8 = local_5dc0._8_8_;
                                      uStack_5cb0 = local_5dc0._16_8_;
                                      uStack_5ca8 = local_5dc0._24_8_;
                                      auVar73 = vpcmpeqd_avx2(local_5c60,local_5c60);
                                      local_5e90[1] = auVar73;
                                      *local_5e90 = auVar73;
                                      local_5c40 = pRVar8->instID[0];
                                      uStack_5c3c = local_5c40;
                                      uStack_5c38 = local_5c40;
                                      uStack_5c34 = local_5c40;
                                      uStack_5c30 = local_5c40;
                                      uStack_5c2c = local_5c40;
                                      uStack_5c28 = local_5c40;
                                      uStack_5c24 = local_5c40;
                                      local_5c20 = pRVar8->instPrimID[0];
                                      uStack_5c1c = local_5c20;
                                      uStack_5c18 = local_5c20;
                                      uStack_5c14 = local_5c20;
                                      uStack_5c10 = local_5c20;
                                      uStack_5c0c = local_5c20;
                                      uStack_5c08 = local_5c20;
                                      uStack_5c04 = local_5c20;
                                      local_5c00 = *(undefined1 (*) [32])(ray + 0x100);
                                      auVar73 = vblendmps_avx512vl(local_5c00,local_5be0);
                                      bVar66 = (bool)((byte)local_5f90 >> 1 & 1);
                                      bVar9 = (bool)((byte)local_5f90 >> 2 & 1);
                                      bVar10 = (bool)((byte)local_5f90 >> 3 & 1);
                                      bVar11 = (bool)((byte)local_5f90 >> 4 & 1);
                                      bVar12 = (bool)((byte)local_5f90 >> 5 & 1);
                                      bVar13 = (bool)((byte)local_5f90 >> 6 & 1);
                                      *(uint *)(ray + 0x100) =
                                           (uint)((byte)local_5f90 & 1) * auVar73._0_4_ |
                                           (uint)!(bool)((byte)local_5f90 & 1) * local_5c00._0_4_;
                                      *(uint *)(ray + 0x104) =
                                           (uint)bVar66 * auVar73._4_4_ |
                                           (uint)!bVar66 * local_5c00._4_4_;
                                      *(uint *)(ray + 0x108) =
                                           (uint)bVar9 * auVar73._8_4_ |
                                           (uint)!bVar9 * local_5c00._8_4_;
                                      *(uint *)(ray + 0x10c) =
                                           (uint)bVar10 * auVar73._12_4_ |
                                           (uint)!bVar10 * local_5c00._12_4_;
                                      *(uint *)(ray + 0x110) =
                                           (uint)bVar11 * auVar73._16_4_ |
                                           (uint)!bVar11 * local_5c00._16_4_;
                                      *(uint *)(ray + 0x114) =
                                           (uint)bVar12 * auVar73._20_4_ |
                                           (uint)!bVar12 * local_5c00._20_4_;
                                      *(uint *)(ray + 0x118) =
                                           (uint)bVar13 * auVar73._24_4_ |
                                           (uint)!bVar13 * local_5c00._24_4_;
                                      *(uint *)(ray + 0x11c) =
                                           (uint)((byte)local_5f90 >> 7) * auVar73._28_4_ |
                                           (uint)!(bool)((byte)local_5f90 >> 7) * local_5c00._28_4_;
                                      local_5e40 = vpmovm2d_avx512vl((ulong)(byte)local_5f90);
                                      local_5f80.geometryUserPtr = local_5ef8->userPtr;
                                      local_5f80.valid = (int *)local_5e40;
                                      local_5f80.context = context->user;
                                      local_5f80.ray = (RTCRayN *)ray;
                                      local_5f80.hit = (RTCHitN *)&local_5d20;
                                      local_5f80.N = 8;
                                      if (local_5ef8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                        auVar143 = (undefined1  [36])0x0;
                                        auVar146 = (undefined1  [36])0x0;
                                        (*local_5ef8->occlusionFilterN)(&local_5f80);
                                      }
                                      if (local_5e40 == (undefined1  [32])0x0) {
                                        local_5f90 = 0;
                                      }
                                      else {
                                        p_Var7 = context->args->filter;
                                        if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                                           (((context->args->flags &
                                             RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                            (((local_5ef8->field_8).field_0x2 & 0x40) != 0)))) {
                                          auVar143 = (undefined1  [36])0x0;
                                          auVar146 = (undefined1  [36])0x0;
                                          (*p_Var7)(&local_5f80);
                                        }
                                        uVar56 = vptestmd_avx512vl(local_5e40,local_5e40);
                                        iVar52 = *(int *)(local_5f80.ray + 0x104);
                                        iVar35 = *(int *)(local_5f80.ray + 0x108);
                                        iVar36 = *(int *)(local_5f80.ray + 0x10c);
                                        iVar37 = *(int *)(local_5f80.ray + 0x110);
                                        iVar38 = *(int *)(local_5f80.ray + 0x114);
                                        iVar39 = *(int *)(local_5f80.ray + 0x118);
                                        iVar40 = *(int *)(local_5f80.ray + 0x11c);
                                        auVar73 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                        bVar66 = (bool)((byte)uVar56 & 1);
                                        bVar9 = (bool)((byte)(uVar56 >> 1) & 1);
                                        bVar10 = (bool)((byte)(uVar56 >> 2) & 1);
                                        bVar11 = (bool)((byte)(uVar56 >> 3) & 1);
                                        bVar12 = (bool)((byte)(uVar56 >> 4) & 1);
                                        bVar13 = (bool)((byte)(uVar56 >> 5) & 1);
                                        bVar16 = (bool)((byte)(uVar56 >> 6) & 1);
                                        bVar19 = SUB81(uVar56 >> 7,0);
                                        local_5f90 = (uint)uVar56;
                                        *(uint *)&local_5f80.ray[0x100].field_0x0 =
                                             (uint)bVar66 * auVar73._0_4_ |
                                             (uint)!bVar66 *
                                             *(int *)&local_5f80.ray[0x100].field_0x0;
                                        *(uint *)(local_5f80.ray + 0x104) =
                                             (uint)bVar9 * auVar73._4_4_ | (uint)!bVar9 * iVar52;
                                        *(uint *)(local_5f80.ray + 0x108) =
                                             (uint)bVar10 * auVar73._8_4_ | (uint)!bVar10 * iVar35;
                                        *(uint *)(local_5f80.ray + 0x10c) =
                                             (uint)bVar11 * auVar73._12_4_ | (uint)!bVar11 * iVar36;
                                        *(uint *)(local_5f80.ray + 0x110) =
                                             (uint)bVar12 * auVar73._16_4_ | (uint)!bVar12 * iVar37;
                                        *(uint *)(local_5f80.ray + 0x114) =
                                             (uint)bVar13 * auVar73._20_4_ | (uint)!bVar13 * iVar38;
                                        *(uint *)(local_5f80.ray + 0x118) =
                                             (uint)bVar16 * auVar73._24_4_ | (uint)!bVar16 * iVar39;
                                        *(uint *)(local_5f80.ray + 0x11c) =
                                             (uint)bVar19 * auVar73._28_4_ | (uint)!bVar19 * iVar40;
                                      }
                                      bVar66 = (bool)((byte)(local_5f90 >> 1) & 1);
                                      bVar9 = (bool)((byte)(local_5f90 >> 2) & 1);
                                      bVar10 = (bool)((byte)(local_5f90 >> 3) & 1);
                                      bVar11 = (bool)((byte)(local_5f90 >> 4) & 1);
                                      bVar12 = (bool)((byte)(local_5f90 >> 5) & 1);
                                      bVar13 = (bool)((byte)(local_5f90 >> 6) & 1);
                                      bVar16 = (bool)((byte)(local_5f90 >> 7) & 1);
                                      *(uint *)(ray + 0x100) =
                                           (uint)((byte)local_5f90 & 1) * *(int *)(ray + 0x100) |
                                           (uint)!(bool)((byte)local_5f90 & 1) * local_5c00._0_4_;
                                      *(uint *)(ray + 0x104) =
                                           (uint)bVar66 * *(int *)(ray + 0x104) |
                                           (uint)!bVar66 * local_5c00._4_4_;
                                      *(uint *)(ray + 0x108) =
                                           (uint)bVar9 * *(int *)(ray + 0x108) |
                                           (uint)!bVar9 * local_5c00._8_4_;
                                      *(uint *)(ray + 0x10c) =
                                           (uint)bVar10 * *(int *)(ray + 0x10c) |
                                           (uint)!bVar10 * local_5c00._12_4_;
                                      *(uint *)(ray + 0x110) =
                                           (uint)bVar11 * *(int *)(ray + 0x110) |
                                           (uint)!bVar11 * local_5c00._16_4_;
                                      *(uint *)(ray + 0x114) =
                                           (uint)bVar12 * *(int *)(ray + 0x114) |
                                           (uint)!bVar12 * local_5c00._20_4_;
                                      *(uint *)(ray + 0x118) =
                                           (uint)bVar13 * *(int *)(ray + 0x118) |
                                           (uint)!bVar13 * local_5c00._24_4_;
                                      *(uint *)(ray + 0x11c) =
                                           (uint)bVar16 * *(int *)(ray + 0x11c) |
                                           (uint)!bVar16 * local_5c00._28_4_;
                                      auVar73 = *(undefined1 (*) [32])ray;
                                      auVar110 = ZEXT3264(*(undefined1 (*) [32])(ray + 0x20));
                                      auVar116 = ZEXT3264(*(undefined1 (*) [32])(ray + 0x40));
                                      auVar75 = *(undefined1 (*) [32])(ray + 0x80);
                                      auVar78 = *(undefined1 (*) [32])(ray + 0xa0);
                                      auVar74 = *(undefined1 (*) [32])(ray + 0xc0);
                                    }
                                    bVar57 = bVar57 & ~(byte)local_5f90;
                                    auVar79 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                    auVar89 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                    auVar77 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                    auVar76 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                    auVar71 = vxorps_avx512vl(auVar68,auVar68);
                                    auVar68 = vmovdqa64_avx512vl(local_5f30);
                                    auVar145 = auVar146;
                                  }
                                  auVar129 = ZEXT1664(auVar68);
                                  auVar154 = ZEXT1664(auVar71);
                                  auVar152 = ZEXT3264(auVar76);
                                  auVar151 = ZEXT3264(auVar77);
                                  auVar150 = ZEXT3264(auVar89);
                                  auVar149 = ZEXT3264(auVar79);
                                  auVar68 = vmovdqa64_avx512vl(local_5f40);
                                  auVar155 = ZEXT1664(auVar68);
                                  auVar79 = local_5d40;
                                  auVar80 = local_5d60;
                                  auVar81 = local_5d80;
                                }
                              }
                            }
                            auVar153 = auVar154._0_16_;
                            auVar41._4_4_ = fStack_5f1c;
                            auVar41._0_4_ = local_5f20;
                            auVar41._8_4_ = fStack_5f18;
                            auVar41._12_4_ = fStack_5f14;
                            auVar41._16_4_ = fStack_5f10;
                            auVar41._20_4_ = fStack_5f0c;
                            auVar41._24_4_ = fStack_5f08;
                            auVar41._28_4_ = fStack_5f04;
                            auVar42._4_4_ = fStack_5e5c;
                            auVar42._0_4_ = local_5e60;
                            auVar42._8_4_ = fStack_5e58;
                            auVar42._12_4_ = fStack_5e54;
                            auVar42._16_4_ = fStack_5e50;
                            auVar42._20_4_ = fStack_5e4c;
                            auVar42._24_4_ = fStack_5e48;
                            auVar42._28_4_ = fStack_5e44;
                            auVar44._4_4_ = fStack_5dfc;
                            auVar44._0_4_ = local_5e00;
                            auVar44._8_4_ = fStack_5df8;
                            auVar44._12_4_ = fStack_5df4;
                            auVar44._16_4_ = fStack_5df0;
                            auVar44._20_4_ = fStack_5dec;
                            auVar44._24_4_ = fStack_5de8;
                            auVar44._28_4_ = fStack_5de4;
                            auVar43._4_4_ = fStack_5e1c;
                            auVar43._0_4_ = local_5e20;
                            auVar43._8_4_ = fStack_5e18;
                            auVar43._12_4_ = fStack_5e14;
                            auVar43._16_4_ = fStack_5e10;
                            auVar43._20_4_ = fStack_5e0c;
                            auVar43._24_4_ = fStack_5e08;
                            auVar43._28_4_ = fStack_5e04;
                            auVar76 = vsubps_avx512vl(auVar79,auVar42);
                            auVar77 = vsubps_avx512vl(auVar80,auVar44);
                            auVar89 = vsubps_avx512vl(auVar81,auVar43);
                            auVar82 = vsubps_avx512vl(auVar41,auVar79);
                            auVar83 = vsubps_avx512vl(_local_5ee0,auVar80);
                            auVar84 = vsubps_avx512vl(_local_5ec0,auVar81);
                            auVar86 = vmulps_avx512vl(auVar77,auVar84);
                            vVar85.field_0 =
                                 (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)
                                 vfmsub231ps_avx512vl(auVar86,auVar83,auVar89);
                            auVar86 = vmulps_avx512vl(auVar89,auVar82);
                            local_5d20.field_0.y.field_0 =
                                 (vfloat_impl<8>)vfmsub231ps_avx512vl(auVar86,auVar84,auVar76);
                            auVar86 = vmulps_avx512vl(auVar76,auVar83);
                            local_5d20.field_0.z.field_0 =
                                 (vfloat_impl<8>)vfmsub231ps_avx512vl(auVar86,auVar82,auVar77);
                            auVar73 = vsubps_avx512vl(auVar79,auVar73);
                            auVar79 = vsubps_avx512vl(auVar80,auVar110._0_32_);
                            auVar80 = vsubps_avx512vl(auVar81,auVar116._0_32_);
                            fVar90 = auVar80._0_4_;
                            auVar111._0_4_ = fVar90 * auVar78._0_4_;
                            fVar103 = auVar80._4_4_;
                            auVar111._4_4_ = fVar103 * auVar78._4_4_;
                            fVar125 = auVar80._8_4_;
                            auVar111._8_4_ = fVar125 * auVar78._8_4_;
                            fVar131 = auVar80._12_4_;
                            auVar111._12_4_ = fVar131 * auVar78._12_4_;
                            fVar132 = auVar80._16_4_;
                            auVar111._16_4_ = fVar132 * auVar78._16_4_;
                            fVar133 = auVar80._20_4_;
                            auVar111._20_4_ = fVar133 * auVar78._20_4_;
                            auVar111._28_36_ = auVar110._28_36_;
                            fVar134 = auVar80._24_4_;
                            auVar111._24_4_ = fVar134 * auVar78._24_4_;
                            auVar71 = vfmsub231ps_fma(auVar111._0_32_,auVar79,auVar74);
                            auVar142._0_4_ = auVar74._0_4_ * auVar73._0_4_;
                            auVar142._4_4_ = auVar74._4_4_ * auVar73._4_4_;
                            auVar142._8_4_ = auVar74._8_4_ * auVar73._8_4_;
                            auVar142._12_4_ = auVar74._12_4_ * auVar73._12_4_;
                            auVar142._16_4_ = auVar74._16_4_ * auVar73._16_4_;
                            auVar142._20_4_ = auVar74._20_4_ * auVar73._20_4_;
                            auVar142._24_4_ = auVar74._24_4_ * auVar73._24_4_;
                            auVar142._28_36_ = auVar143;
                            auVar69 = vfmsub231ps_fma(auVar142._0_32_,auVar80,auVar75);
                            auVar144._0_4_ = auVar79._0_4_ * auVar75._0_4_;
                            auVar144._4_4_ = auVar79._4_4_ * auVar75._4_4_;
                            auVar144._8_4_ = auVar79._8_4_ * auVar75._8_4_;
                            auVar144._12_4_ = auVar79._12_4_ * auVar75._12_4_;
                            auVar144._16_4_ = auVar79._16_4_ * auVar75._16_4_;
                            auVar144._20_4_ = auVar79._20_4_ * auVar75._20_4_;
                            auVar144._24_4_ = auVar79._24_4_ * auVar75._24_4_;
                            auVar144._28_36_ = auVar145;
                            auVar148 = vfmsub231ps_fma(auVar144._0_32_,auVar73,auVar78);
                            auVar110._0_4_ = local_5d20._64_4_ * auVar74._0_4_;
                            auVar110._4_4_ = local_5d20._68_4_ * auVar74._4_4_;
                            auVar110._8_4_ = local_5d20._72_4_ * auVar74._8_4_;
                            auVar110._12_4_ = local_5d20._76_4_ * auVar74._12_4_;
                            auVar110._16_4_ = local_5d20._80_4_ * auVar74._16_4_;
                            auVar110._20_4_ = local_5d20._84_4_ * auVar74._20_4_;
                            auVar110._28_36_ = auVar116._28_36_;
                            auVar110._24_4_ = local_5d20._88_4_ * auVar74._24_4_;
                            auVar68 = vfmadd231ps_fma(auVar110._0_32_,
                                                      (undefined1  [32])local_5d20.field_0.y.field_0
                                                      ,auVar78);
                            auVar68 = vfmadd231ps_fma(ZEXT1632(auVar68),
                                                      (undefined1  [32])vVar85.field_0,auVar75);
                            vandps_avx512vl(ZEXT1632(auVar68),auVar152._0_32_);
                            auVar75 = vmulps_avx512vl(auVar84,ZEXT1632(auVar148));
                            auVar75 = vfmadd231ps_avx512vl(auVar75,ZEXT1632(auVar69),auVar83);
                            auVar75 = vfmadd231ps_avx512vl(auVar75,ZEXT1632(auVar71),auVar82);
                            fVar91 = auVar75._0_4_;
                            auVar101._0_4_ = (uint)fVar90 ^ (uint)fVar91;
                            fVar94 = auVar75._4_4_;
                            auVar101._4_4_ = (uint)fVar103 ^ (uint)fVar94;
                            fVar95 = auVar75._8_4_;
                            auVar101._8_4_ = (uint)fVar125 ^ (uint)fVar95;
                            fVar96 = auVar75._12_4_;
                            auVar101._12_4_ = (uint)fVar131 ^ (uint)fVar96;
                            fVar136 = auVar75._16_4_;
                            auVar101._16_4_ = (uint)fVar132 ^ (uint)fVar136;
                            fVar137 = auVar75._20_4_;
                            auVar101._20_4_ = (uint)fVar133 ^ (uint)fVar137;
                            fVar138 = auVar75._24_4_;
                            auVar101._24_4_ = (uint)fVar134 ^ (uint)fVar138;
                            uVar119 = auVar80._28_4_;
                            auVar101._28_4_ = uVar119 ^ auVar75._28_4_;
                            uVar20 = vcmpps_avx512vl(auVar101,auVar154._0_32_,5);
                            bVar51 = (byte)uVar20 & bVar57;
                            if (bVar51 != 0) {
                              auVar30._4_4_ = auVar89._4_4_ * auVar148._4_4_;
                              auVar30._0_4_ = auVar89._0_4_ * auVar148._0_4_;
                              auVar30._8_4_ = auVar89._8_4_ * auVar148._8_4_;
                              auVar30._12_4_ = auVar89._12_4_ * auVar148._12_4_;
                              auVar30._16_4_ = auVar89._16_4_ * 0.0;
                              auVar30._20_4_ = auVar89._20_4_ * 0.0;
                              auVar30._24_4_ = auVar89._24_4_ * 0.0;
                              auVar30._28_4_ = auVar75._28_4_;
                              auVar69 = vfmadd213ps_fma(ZEXT1632(auVar69),auVar77,auVar30);
                              auVar71 = vfmadd213ps_fma(ZEXT1632(auVar71),auVar76,ZEXT1632(auVar69))
                              ;
                              auVar109._0_4_ = (uint)fVar90 ^ auVar71._0_4_;
                              auVar109._4_4_ = (uint)fVar103 ^ auVar71._4_4_;
                              auVar109._8_4_ = (uint)fVar125 ^ auVar71._8_4_;
                              auVar109._12_4_ = (uint)fVar131 ^ auVar71._12_4_;
                              auVar109._16_4_ = fVar132;
                              auVar109._20_4_ = fVar133;
                              auVar109._24_4_ = fVar134;
                              auVar109._28_4_ = uVar119;
                              uVar20 = vcmpps_avx512vl(auVar109,auVar154._0_32_,5);
                              bVar51 = bVar51 & (byte)uVar20;
                              if (bVar51 != 0) {
                                vandps_avx512vl(ZEXT1632(auVar68),auVar149._0_32_);
                                auVar78 = vsubps_avx(auVar75,auVar101);
                                uVar20 = vcmpps_avx512vl(auVar78,auVar109,5);
                                bVar51 = bVar51 & (byte)uVar20;
                                if (bVar51 != 0) {
                                  local_5f40 = vmovdqa64_avx512vl(auVar155._0_16_);
                                  local_5f30 = vmovdqa64_avx512vl(auVar129._0_16_);
                                  auVar31._4_4_ = local_5d20._68_4_ * fVar103;
                                  auVar31._0_4_ = local_5d20._64_4_ * fVar90;
                                  auVar31._8_4_ = local_5d20._72_4_ * fVar125;
                                  auVar31._12_4_ = local_5d20._76_4_ * fVar131;
                                  auVar31._16_4_ = local_5d20._80_4_ * fVar132;
                                  auVar31._20_4_ = local_5d20._84_4_ * fVar133;
                                  auVar31._24_4_ = local_5d20._88_4_ * fVar134;
                                  auVar31._28_4_ = uVar119;
                                  auVar71 = vfmadd213ps_fma(auVar79,(undefined1  [32])
                                                                    local_5d20.field_0.y.field_0,
                                                            auVar31);
                                  auVar71 = vfmadd213ps_fma(auVar73,(undefined1  [32])vVar85.field_0
                                                            ,ZEXT1632(auVar71));
                                  auVar127._0_4_ = fVar91 * *(float *)(ray + 0x60);
                                  auVar127._4_4_ = fVar94 * *(float *)(ray + 100);
                                  auVar127._8_4_ = fVar95 * *(float *)(ray + 0x68);
                                  auVar127._12_4_ = fVar96 * *(float *)(ray + 0x6c);
                                  auVar127._16_4_ = fVar136 * *(float *)(ray + 0x70);
                                  auVar127._20_4_ = fVar137 * *(float *)(ray + 0x74);
                                  auVar127._24_4_ = fVar138 * *(float *)(ray + 0x78);
                                  auVar127._28_4_ = 0;
                                  auVar107._0_4_ = (float)((uint)fVar90 ^ auVar71._0_4_);
                                  auVar107._4_4_ = (float)((uint)fVar103 ^ auVar71._4_4_);
                                  auVar107._8_4_ = (float)((uint)fVar125 ^ auVar71._8_4_);
                                  auVar107._12_4_ = (float)((uint)fVar131 ^ auVar71._12_4_);
                                  auVar107._16_4_ = fVar132;
                                  auVar107._20_4_ = fVar133;
                                  auVar107._24_4_ = fVar134;
                                  auVar107._28_4_ = uVar119;
                                  auVar32._4_4_ = fVar94 * *(float *)(ray + 0x104);
                                  auVar32._0_4_ = fVar91 * *(float *)(ray + 0x100);
                                  auVar32._8_4_ = fVar95 * *(float *)(ray + 0x108);
                                  auVar32._12_4_ = fVar96 * *(float *)(ray + 0x10c);
                                  auVar32._16_4_ = fVar136 * *(float *)(ray + 0x110);
                                  auVar32._20_4_ = fVar137 * *(float *)(ray + 0x114);
                                  auVar32._24_4_ = fVar138 * *(float *)(ray + 0x118);
                                  auVar32._28_4_ = uVar119;
                                  uVar20 = vcmpps_avx512vl(auVar107,auVar32,2);
                                  uVar21 = vcmpps_avx512vl(auVar127,auVar107,1);
                                  bVar51 = bVar51 & (byte)uVar20 & (byte)uVar21;
                                  if (bVar51 == 0) {
LAB_01ded301:
                                    auVar75 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                    auVar73 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                    auVar78 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                    auVar74 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                    auVar70 = vxorps_avx512vl(auVar153,auVar153);
                                    auVar68 = vmovdqa64_avx512vl(local_5f30);
                                  }
                                  else {
                                    uVar20 = vcmpps_avx512vl(ZEXT1632(auVar68),ZEXT832(0) << 0x20,4)
                                    ;
                                    bVar51 = bVar51 & (byte)uVar20;
                                    if (bVar51 == 0) goto LAB_01ded301;
                                    local_5ec0 = (undefined1  [8])
                                                 CONCAT44(0,*(uint *)(local_5d90 + uVar67 * 4));
                                    pGVar6 = (context->scene->geometries).items
                                             [CONCAT44(0,*(uint *)(local_5d90 + uVar67 * 4))].ptr;
                                    local_5ee0 = (undefined1  [8])pGVar6;
                                    uVar3 = pGVar6->mask;
                                    auVar113._4_4_ = uVar3;
                                    auVar113._0_4_ = uVar3;
                                    auVar113._8_4_ = uVar3;
                                    auVar113._12_4_ = uVar3;
                                    auVar113._16_4_ = uVar3;
                                    auVar113._20_4_ = uVar3;
                                    auVar113._24_4_ = uVar3;
                                    auVar113._28_4_ = uVar3;
                                    uVar20 = vptestmd_avx512vl(auVar113,*(undefined1 (*) [32])
                                                                         (ray + 0x120));
                                    bVar54 = (byte)uVar20 & bVar51;
                                    local_5f20 = (float)(uint)bVar54;
                                    if (bVar54 == 0) goto LAB_01ded301;
                                    local_5e60 = *(float *)(local_5da0 + uVar67 * 4);
                                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                       (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                      auVar73 = vsubps_avx(auVar75,auVar109);
                                      auVar68 = vcvtsi2ss_avx512f(auVar72,*(ushort *)
                                                                           (local_5e78 + 8 +
                                                                           local_5e80) - 1);
                                      auVar34._12_4_ = 0;
                                      auVar34._0_12_ = ZEXT812(0);
                                      auVar71 = vrcp14ss_avx512f(auVar34 << 0x20,
                                                                 ZEXT416(auVar68._0_4_));
                                      auVar68 = vfnmadd213ss_fma(auVar68,auVar71,
                                                                 SUB6416(ZEXT464(0x40000000),0));
                                      fVar90 = auVar71._0_4_ * auVar68._0_4_;
                                      auVar68 = vcvtsi2ss_avx512f(auVar72,*(ushort *)
                                                                           (local_5e78 + 10 +
                                                                           local_5e80) - 1);
                                      auVar72 = vrcp14ss_avx512f(auVar34 << 0x20,
                                                                 ZEXT416(auVar68._0_4_));
                                      auVar68 = vfnmadd213ss_fma(auVar68,auVar72,
                                                                 SUB6416(ZEXT464(0x40000000),0));
                                      fVar103 = auVar72._0_4_ * auVar68._0_4_;
                                      auVar68 = vcvtsi2ss_avx512f(auVar147,((uint)uVar67 & 1) +
                                                                           local_5f84);
                                      fVar125 = auVar68._0_4_;
                                      auVar128._0_4_ = fVar125 * fVar91 + auVar78._0_4_;
                                      auVar128._4_4_ = fVar125 * fVar94 + auVar78._4_4_;
                                      auVar128._8_4_ = fVar125 * fVar95 + auVar78._8_4_;
                                      auVar128._12_4_ = fVar125 * fVar96 + auVar78._12_4_;
                                      auVar128._16_4_ = fVar125 * fVar136 + auVar78._16_4_;
                                      auVar128._20_4_ = fVar125 * fVar137 + auVar78._20_4_;
                                      auVar128._24_4_ = fVar125 * fVar138 + auVar78._24_4_;
                                      auVar128._28_4_ = fVar125 + auVar78._28_4_;
                                      auVar114._4_4_ = fVar90;
                                      auVar114._0_4_ = fVar90;
                                      auVar114._8_4_ = fVar90;
                                      auVar114._12_4_ = fVar90;
                                      auVar114._16_4_ = fVar90;
                                      auVar114._20_4_ = fVar90;
                                      auVar114._24_4_ = fVar90;
                                      auVar114._28_4_ = fVar90;
                                      auVar74 = vmulps_avx512vl(auVar128,auVar114);
                                      bVar66 = (bool)(bVar51 >> 1 & 1);
                                      bVar10 = (bool)(bVar51 >> 2 & 1);
                                      bVar12 = (bool)(bVar51 >> 3 & 1);
                                      bVar16 = (bool)(bVar51 >> 4 & 1);
                                      bVar14 = (bool)(bVar51 >> 5 & 1);
                                      bVar17 = (bool)(bVar51 >> 6 & 1);
                                      auVar68 = vcvtsi2ss_avx512f(auVar70,((uint)(uVar67 >> 1) &
                                                                          0x7fffffff) + local_5f88);
                                      fVar90 = auVar68._0_4_;
                                      auVar115._0_4_ = auVar73._0_4_ + fVar90 * fVar91;
                                      auVar115._4_4_ = auVar73._4_4_ + fVar90 * fVar94;
                                      auVar115._8_4_ = auVar73._8_4_ + fVar90 * fVar95;
                                      auVar115._12_4_ = auVar73._12_4_ + fVar90 * fVar96;
                                      auVar115._16_4_ = auVar73._16_4_ + fVar90 * fVar136;
                                      auVar115._20_4_ = auVar73._20_4_ + fVar90 * fVar137;
                                      auVar115._24_4_ = auVar73._24_4_ + fVar90 * fVar138;
                                      auVar115._28_4_ = auVar73._28_4_ + fVar90;
                                      auVar118._4_4_ = fVar103;
                                      auVar118._0_4_ = fVar103;
                                      auVar118._8_4_ = fVar103;
                                      auVar118._12_4_ = fVar103;
                                      auVar118._16_4_ = fVar103;
                                      auVar118._20_4_ = fVar103;
                                      auVar118._24_4_ = fVar103;
                                      auVar118._28_4_ = fVar103;
                                      auVar76 = vmulps_avx512vl(auVar115,auVar118);
                                      bVar9 = (bool)(bVar51 >> 1 & 1);
                                      bVar11 = (bool)(bVar51 >> 2 & 1);
                                      bVar13 = (bool)(bVar51 >> 3 & 1);
                                      bVar19 = (bool)(bVar51 >> 4 & 1);
                                      bVar15 = (bool)(bVar51 >> 5 & 1);
                                      bVar18 = (bool)(bVar51 >> 6 & 1);
                                      auVar77 = vrcp14ps_avx512vl(auVar75);
                                      auVar26._8_4_ = 0x3f800000;
                                      auVar26._0_8_ = 0x3f8000003f800000;
                                      auVar26._12_4_ = 0x3f800000;
                                      auVar26._16_4_ = 0x3f800000;
                                      auVar26._20_4_ = 0x3f800000;
                                      auVar26._24_4_ = 0x3f800000;
                                      auVar26._28_4_ = 0x3f800000;
                                      auVar75 = vfnmadd213ps_avx512vl(auVar75,auVar77,auVar26);
                                      auVar68 = vfmadd132ps_fma(auVar75,auVar77,auVar77);
                                      fVar91 = auVar68._0_4_;
                                      fVar94 = auVar68._4_4_;
                                      fVar95 = auVar68._8_4_;
                                      fVar96 = auVar68._12_4_;
                                      local_5ca0._0_4_ =
                                           (float)((uint)(bVar51 & 1) * auVar76._0_4_ |
                                                  (uint)!(bool)(bVar51 & 1) * (int)auVar73._0_4_) *
                                           fVar91;
                                      local_5ca0._4_4_ =
                                           (float)((uint)bVar9 * auVar76._4_4_ |
                                                  (uint)!bVar9 * (int)auVar73._4_4_) * fVar94;
                                      fStack_5c98 = (float)((uint)bVar11 * auVar76._8_4_ |
                                                           (uint)!bVar11 * (int)auVar73._8_4_) *
                                                    fVar95;
                                      fStack_5c94 = (float)((uint)bVar13 * auVar76._12_4_ |
                                                           (uint)!bVar13 * (int)auVar73._12_4_) *
                                                    fVar96;
                                      fStack_5c90 = (float)((uint)bVar19 * auVar76._16_4_ |
                                                           (uint)!bVar19 * (int)auVar73._16_4_) *
                                                    0.0;
                                      fStack_5c8c = (float)((uint)bVar15 * auVar76._20_4_ |
                                                           (uint)!bVar15 * (int)auVar73._20_4_) *
                                                    0.0;
                                      fStack_5c88 = (float)((uint)bVar18 * auVar76._24_4_ |
                                                           (uint)!bVar18 * (int)auVar73._24_4_) *
                                                    0.0;
                                      fStack_5c84 = 0.0;
                                      local_5cc0 = CONCAT44(fVar94 * auVar107._4_4_,
                                                            fVar91 * auVar107._0_4_);
                                      uStack_5cb8 = CONCAT44(fVar96 * auVar107._12_4_,
                                                             fVar95 * auVar107._8_4_);
                                      uStack_5cb0 = CONCAT44(fVar133 * 0.0,fVar132 * 0.0);
                                      uStack_5ca8 = CONCAT44(uVar119,fVar134 * 0.0);
                                      local_5c80._4_4_ =
                                           (float)((uint)bVar66 * auVar74._4_4_ |
                                                  (uint)!bVar66 * (int)auVar78._4_4_) * fVar94;
                                      local_5c80._0_4_ =
                                           (float)((uint)(bVar51 & 1) * auVar74._0_4_ |
                                                  (uint)!(bool)(bVar51 & 1) * (int)auVar78._0_4_) *
                                           fVar91;
                                      fStack_5c78 = (float)((uint)bVar10 * auVar74._8_4_ |
                                                           (uint)!bVar10 * (int)auVar78._8_4_) *
                                                    fVar95;
                                      fStack_5c74 = (float)((uint)bVar12 * auVar74._12_4_ |
                                                           (uint)!bVar12 * (int)auVar78._12_4_) *
                                                    fVar96;
                                      fStack_5c70 = (float)((uint)bVar16 * auVar74._16_4_ |
                                                           (uint)!bVar16 * (int)auVar78._16_4_) *
                                                    0.0;
                                      fStack_5c6c = (float)((uint)bVar14 * auVar74._20_4_ |
                                                           (uint)!bVar14 * (int)auVar78._20_4_) *
                                                    0.0;
                                      fStack_5c68 = (float)((uint)bVar17 * auVar74._24_4_ |
                                                           (uint)!bVar17 * (int)auVar78._24_4_) *
                                                    0.0;
                                      fStack_5c64 = (float)((uint)(bVar51 >> 7) * auVar74._28_4_ |
                                                           (uint)!(bool)(bVar51 >> 7) *
                                                           (int)auVar78._28_4_);
                                      local_5f80.geometryUserPtr = local_5be0;
                                      local_5f80.valid = (int *)local_5ba0;
                                      local_5f80.context = (RTCRayQueryContext *)local_5bc0;
                                      local_5f80.ray = (RTCRayN *)local_5dc0;
                                      local_5d20.field_0.x.field_0 =
                                           (vfloat_impl<8>)(undefined1  [32])vVar85.field_0;
                                      std::
                                      _Tuple_impl<0ul,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::Vec3<embree::vfloat_impl<8>>&>
                                      ::
                                      _M_assign<embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::Vec3<embree::vfloat_impl<8>>>
                                                ((_Tuple_impl<0UL,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::Vec3<embree::vfloat_impl<8>_>_&>
                                                  *)&local_5f80,
                                                 (_Tuple_impl<0UL,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::Vec3<embree::vfloat_impl<8>_>_>
                                                  *)&local_5d20.field_0);
                                      pRVar8 = context->user;
                                      local_5c60 = vpbroadcastd_avx512vl();
                                      _local_5c80 = vpbroadcastd_avx512vl();
                                      local_5d20.field_0.x.field_0 =
                                           (vfloat_impl<8>)(vfloat_impl<8>)local_5ba0[0];
                                      local_5cc0 = local_5dc0._0_8_;
                                      uStack_5cb8 = local_5dc0._8_8_;
                                      uStack_5cb0 = local_5dc0._16_8_;
                                      uStack_5ca8 = local_5dc0._24_8_;
                                      auVar73 = vpcmpeqd_avx2(local_5c60,local_5c60);
                                      local_5e90[1] = auVar73;
                                      *local_5e90 = auVar73;
                                      local_5c40 = pRVar8->instID[0];
                                      uStack_5c3c = local_5c40;
                                      uStack_5c38 = local_5c40;
                                      uStack_5c34 = local_5c40;
                                      uStack_5c30 = local_5c40;
                                      uStack_5c2c = local_5c40;
                                      uStack_5c28 = local_5c40;
                                      uStack_5c24 = local_5c40;
                                      local_5c20 = pRVar8->instPrimID[0];
                                      uStack_5c1c = local_5c20;
                                      uStack_5c18 = local_5c20;
                                      uStack_5c14 = local_5c20;
                                      uStack_5c10 = local_5c20;
                                      uStack_5c0c = local_5c20;
                                      uStack_5c08 = local_5c20;
                                      uStack_5c04 = local_5c20;
                                      _local_5ec0 = *(undefined1 (*) [32])(ray + 0x100);
                                      auVar73 = vblendmps_avx512vl(_local_5ec0,local_5be0);
                                      bVar66 = (bool)(SUB41(local_5f20,0) & 1);
                                      bVar9 = (bool)((byte)((uint)local_5f20 >> 1) & 1);
                                      bVar10 = (bool)((byte)((uint)local_5f20 >> 2) & 1);
                                      bVar11 = (bool)((byte)((uint)local_5f20 >> 3) & 1);
                                      bVar12 = (bool)((byte)((uint)local_5f20 >> 4) & 1);
                                      bVar13 = (bool)((byte)((uint)local_5f20 >> 5) & 1);
                                      bVar16 = (bool)((byte)((uint)local_5f20 >> 6) & 1);
                                      bVar19 = (bool)((byte)((uint)local_5f20 >> 7) & 1);
                                      *(uint *)(ray + 0x100) =
                                           (uint)bVar66 * auVar73._0_4_ |
                                           (uint)!bVar66 * local_5ec0._0_4_;
                                      *(uint *)(ray + 0x104) =
                                           (uint)bVar9 * auVar73._4_4_ |
                                           (uint)!bVar9 * local_5ec0._4_4_;
                                      *(uint *)(ray + 0x108) =
                                           (uint)bVar10 * auVar73._8_4_ |
                                           (uint)!bVar10 * local_5ec0._8_4_;
                                      *(uint *)(ray + 0x10c) =
                                           (uint)bVar11 * auVar73._12_4_ |
                                           (uint)!bVar11 * local_5ec0._12_4_;
                                      *(uint *)(ray + 0x110) =
                                           (uint)bVar12 * auVar73._16_4_ |
                                           (uint)!bVar12 * local_5ec0._16_4_;
                                      *(uint *)(ray + 0x114) =
                                           (uint)bVar13 * auVar73._20_4_ |
                                           (uint)!bVar13 * local_5ec0._20_4_;
                                      *(uint *)(ray + 0x118) =
                                           (uint)bVar16 * auVar73._24_4_ |
                                           (uint)!bVar16 * local_5ec0._24_4_;
                                      *(uint *)(ray + 0x11c) =
                                           (uint)bVar19 * auVar73._28_4_ |
                                           (uint)!bVar19 * local_5ec0._28_4_;
                                      local_5e40 = vpmovm2d_avx512vl((ulong)(uint)local_5f20);
                                      local_5f80.geometryUserPtr =
                                           (void *)*(undefined8 *)((long)local_5ee0 + 0x18);
                                      local_5f80.valid = (int *)local_5e40;
                                      local_5f80.context = context->user;
                                      local_5f80.ray = (RTCRayN *)ray;
                                      local_5f80.hit = (RTCHitN *)&local_5d20;
                                      local_5f80.N = 8;
                                      if (*(code **)((long)local_5ee0 + 0x48) != (code *)0x0) {
                                        (**(code **)((long)local_5ee0 + 0x48))(&local_5f80);
                                      }
                                      if (local_5e40 == (undefined1  [32])0x0) {
                                        local_5f20 = 0.0;
                                      }
                                      else {
                                        p_Var7 = context->args->filter;
                                        if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                                           (((context->args->flags &
                                             RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                            ((*(byte *)((long)local_5ee0 + 0x3e) & 0x40) != 0)))) {
                                          (*p_Var7)(&local_5f80);
                                        }
                                        uVar56 = vptestmd_avx512vl(local_5e40,local_5e40);
                                        iVar52 = *(int *)(local_5f80.ray + 0x104);
                                        iVar35 = *(int *)(local_5f80.ray + 0x108);
                                        iVar36 = *(int *)(local_5f80.ray + 0x10c);
                                        iVar37 = *(int *)(local_5f80.ray + 0x110);
                                        iVar38 = *(int *)(local_5f80.ray + 0x114);
                                        iVar39 = *(int *)(local_5f80.ray + 0x118);
                                        iVar40 = *(int *)(local_5f80.ray + 0x11c);
                                        auVar73 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                        bVar66 = (bool)((byte)uVar56 & 1);
                                        bVar9 = (bool)((byte)(uVar56 >> 1) & 1);
                                        bVar10 = (bool)((byte)(uVar56 >> 2) & 1);
                                        bVar11 = (bool)((byte)(uVar56 >> 3) & 1);
                                        bVar12 = (bool)((byte)(uVar56 >> 4) & 1);
                                        bVar13 = (bool)((byte)(uVar56 >> 5) & 1);
                                        bVar16 = (bool)((byte)(uVar56 >> 6) & 1);
                                        bVar19 = SUB81(uVar56 >> 7,0);
                                        local_5f20 = (float)(uint)uVar56;
                                        *(uint *)&local_5f80.ray[0x100].field_0x0 =
                                             (uint)bVar66 * auVar73._0_4_ |
                                             (uint)!bVar66 *
                                             *(int *)&local_5f80.ray[0x100].field_0x0;
                                        *(uint *)(local_5f80.ray + 0x104) =
                                             (uint)bVar9 * auVar73._4_4_ | (uint)!bVar9 * iVar52;
                                        *(uint *)(local_5f80.ray + 0x108) =
                                             (uint)bVar10 * auVar73._8_4_ | (uint)!bVar10 * iVar35;
                                        *(uint *)(local_5f80.ray + 0x10c) =
                                             (uint)bVar11 * auVar73._12_4_ | (uint)!bVar11 * iVar36;
                                        *(uint *)(local_5f80.ray + 0x110) =
                                             (uint)bVar12 * auVar73._16_4_ | (uint)!bVar12 * iVar37;
                                        *(uint *)(local_5f80.ray + 0x114) =
                                             (uint)bVar13 * auVar73._20_4_ | (uint)!bVar13 * iVar38;
                                        *(uint *)(local_5f80.ray + 0x118) =
                                             (uint)bVar16 * auVar73._24_4_ | (uint)!bVar16 * iVar39;
                                        *(uint *)(local_5f80.ray + 0x11c) =
                                             (uint)bVar19 * auVar73._28_4_ | (uint)!bVar19 * iVar40;
                                      }
                                      bVar66 = (bool)(SUB41(local_5f20,0) & 1);
                                      bVar9 = (bool)((byte)((uint)local_5f20 >> 1) & 1);
                                      bVar10 = (bool)((byte)((uint)local_5f20 >> 2) & 1);
                                      bVar11 = (bool)((byte)((uint)local_5f20 >> 3) & 1);
                                      bVar12 = (bool)((byte)((uint)local_5f20 >> 4) & 1);
                                      bVar13 = (bool)((byte)((uint)local_5f20 >> 5) & 1);
                                      bVar16 = (bool)((byte)((uint)local_5f20 >> 6) & 1);
                                      bVar19 = (bool)((byte)((uint)local_5f20 >> 7) & 1);
                                      *(uint *)local_5e88 =
                                           (uint)bVar66 * *(int *)local_5e88 |
                                           (uint)!bVar66 * local_5ec0._0_4_;
                                      *(uint *)(local_5e88 + 4) =
                                           (uint)bVar9 * *(int *)(local_5e88 + 4) |
                                           (uint)!bVar9 * local_5ec0._4_4_;
                                      *(uint *)(local_5e88 + 8) =
                                           (uint)bVar10 * *(int *)(local_5e88 + 8) |
                                           (uint)!bVar10 * (int)fStack_5eb8;
                                      *(uint *)(local_5e88 + 0xc) =
                                           (uint)bVar11 * *(int *)(local_5e88 + 0xc) |
                                           (uint)!bVar11 * (int)fStack_5eb4;
                                      *(uint *)(local_5e88 + 0x10) =
                                           (uint)bVar12 * *(int *)(local_5e88 + 0x10) |
                                           (uint)!bVar12 * (int)fStack_5eb0;
                                      *(uint *)(local_5e88 + 0x14) =
                                           (uint)bVar13 * *(int *)(local_5e88 + 0x14) |
                                           (uint)!bVar13 * (int)fStack_5eac;
                                      *(uint *)(local_5e88 + 0x18) =
                                           (uint)bVar16 * *(int *)(local_5e88 + 0x18) |
                                           (uint)!bVar16 * (int)fStack_5ea8;
                                      *(uint *)(local_5e88 + 0x1c) =
                                           (uint)bVar19 * *(int *)(local_5e88 + 0x1c) |
                                           (uint)!bVar19 * (int)fStack_5ea4;
                                    }
                                    bVar57 = bVar57 & ~SUB41(local_5f20,0);
                                    auVar75 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                    auVar73 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                    auVar78 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                    auVar74 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                    auVar70 = vxorps_avx512vl(auVar153,auVar153);
                                    auVar68 = vmovdqa64_avx512vl(local_5f30);
                                  }
                                  auVar129 = ZEXT1664(auVar68);
                                  auVar154 = ZEXT1664(auVar70);
                                  auVar152 = ZEXT3264(auVar74);
                                  auVar151 = ZEXT3264(auVar78);
                                  auVar150 = ZEXT3264(auVar73);
                                  auVar149 = ZEXT3264(auVar75);
                                  auVar68 = vmovdqa64_avx512vl(local_5f40);
                                  auVar155 = ZEXT1664(auVar68);
                                }
                              }
                            }
                            uVar67 = uVar67 + 1;
                            pfVar64 = pfVar64 + 0x10;
                          } while (bVar57 != 0);
                          bVar57 = 0;
LAB_01ded9f5:
                          bVar60 = bVar60 & bVar57;
                          bVar66 = bVar60 == 0;
                          uVar56 = local_5e68;
                          uVar67 = local_5ef0;
                          lVar55 = local_5e70;
                        }
                      } while ((!bVar66) && (uVar56 = uVar56 - 1 & uVar56, uVar56 != 0));
                    }
                    lVar55 = local_5dc8 + 1;
                  }
                  bVar60 = (byte)local_5fa4 | ~bVar60;
                  local_5fa4 = (uint)bVar60;
                  if (bVar60 == 0xff) {
                    local_5fa4._0_1_ = 0xff;
                    goto LAB_01dedb7b;
                  }
                  auVar73 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                  bVar66 = (bool)(bVar60 >> 1 & 1);
                  bVar9 = (bool)(bVar60 >> 2 & 1);
                  bVar10 = (bool)(bVar60 >> 3 & 1);
                  bVar11 = (bool)(bVar60 >> 4 & 1);
                  bVar12 = (bool)(bVar60 >> 5 & 1);
                  bVar13 = (bool)(bVar60 >> 6 & 1);
                  local_5940 = (uint)(bVar60 & 1) * auVar73._0_4_ | !(bool)(bVar60 & 1) * local_5940
                  ;
                  uStack_593c = (uint)bVar66 * auVar73._4_4_ | !bVar66 * uStack_593c;
                  uStack_5938 = (uint)bVar9 * auVar73._8_4_ | !bVar9 * uStack_5938;
                  uStack_5934 = (uint)bVar10 * auVar73._12_4_ | !bVar10 * uStack_5934;
                  uStack_5930 = (uint)bVar11 * auVar73._16_4_ | !bVar11 * uStack_5930;
                  uStack_592c = (uint)bVar12 * auVar73._20_4_ | !bVar12 * uStack_592c;
                  uStack_5928 = (uint)bVar13 * auVar73._24_4_ | !bVar13 * uStack_5928;
                  uStack_5924 = (uint)(bVar60 >> 7) * auVar73._28_4_ |
                                !(bool)(bVar60 >> 7) * uStack_5924;
                }
                goto LAB_01dec6df;
              }
              auVar73 = auVar151._0_32_;
              for (lVar55 = 0;
                  (auVar129 = ZEXT3264(auVar73), lVar55 != 8 &&
                  (uVar56 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + lVar55 * 8), uVar56 != 8));
                  lVar55 = lVar55 + 1) {
                auVar81._4_4_ = fStack_5a1c;
                auVar81._0_4_ = local_5a20;
                auVar81._8_4_ = fStack_5a18;
                auVar81._12_4_ = fStack_5a14;
                auVar81._16_4_ = fStack_5a10;
                auVar81._20_4_ = fStack_5a0c;
                auVar81._24_4_ = fStack_5a08;
                auVar81._28_4_ = uStack_5a04;
                uVar65 = *(undefined4 *)(root.ptr + 0x40 + lVar55 * 4);
                auVar86._4_4_ = uVar65;
                auVar86._0_4_ = uVar65;
                auVar86._8_4_ = uVar65;
                auVar86._12_4_ = uVar65;
                auVar86._16_4_ = uVar65;
                auVar86._20_4_ = uVar65;
                auVar86._24_4_ = uVar65;
                auVar86._28_4_ = uVar65;
                auVar68 = vfmsub132ps_fma(auVar86,auVar81,local_5a80);
                auVar82._4_4_ = fStack_59fc;
                auVar82._0_4_ = local_5a00;
                auVar82._8_4_ = fStack_59f8;
                auVar82._12_4_ = fStack_59f4;
                auVar82._16_4_ = fStack_59f0;
                auVar82._20_4_ = fStack_59ec;
                auVar82._24_4_ = fStack_59e8;
                auVar82._28_4_ = uStack_59e4;
                uVar65 = *(undefined4 *)(root.ptr + 0x80 + lVar55 * 4);
                auVar87._4_4_ = uVar65;
                auVar87._0_4_ = uVar65;
                auVar87._8_4_ = uVar65;
                auVar87._12_4_ = uVar65;
                auVar87._16_4_ = uVar65;
                auVar87._20_4_ = uVar65;
                auVar87._24_4_ = uVar65;
                auVar87._28_4_ = uVar65;
                uVar65 = *(undefined4 *)(root.ptr + 0xc0 + lVar55 * 4);
                auVar88._4_4_ = uVar65;
                auVar88._0_4_ = uVar65;
                auVar88._8_4_ = uVar65;
                auVar88._12_4_ = uVar65;
                auVar88._16_4_ = uVar65;
                auVar88._20_4_ = uVar65;
                auVar88._24_4_ = uVar65;
                auVar88._28_4_ = uVar65;
                auVar70 = vfmsub132ps_fma(auVar87,auVar82,local_5a60);
                auVar147 = vfmsub132ps_fma(auVar88,local_59e0,local_5a40);
                uVar65 = *(undefined4 *)(root.ptr + 0x60 + lVar55 * 4);
                auVar89._4_4_ = uVar65;
                auVar89._0_4_ = uVar65;
                auVar89._8_4_ = uVar65;
                auVar89._12_4_ = uVar65;
                auVar89._16_4_ = uVar65;
                auVar89._20_4_ = uVar65;
                auVar89._24_4_ = uVar65;
                auVar89._28_4_ = uVar65;
                auVar74 = vfmsub132ps_avx512vl(local_5a80,auVar81,auVar89);
                uVar65 = *(undefined4 *)(root.ptr + 0xa0 + lVar55 * 4);
                auVar79._4_4_ = uVar65;
                auVar79._0_4_ = uVar65;
                auVar79._8_4_ = uVar65;
                auVar79._12_4_ = uVar65;
                auVar79._16_4_ = uVar65;
                auVar79._20_4_ = uVar65;
                auVar79._24_4_ = uVar65;
                auVar79._28_4_ = uVar65;
                auVar76 = vfmsub132ps_avx512vl(local_5a60,auVar82,auVar79);
                uVar65 = *(undefined4 *)(root.ptr + 0xe0 + lVar55 * 4);
                auVar80._4_4_ = uVar65;
                auVar80._0_4_ = uVar65;
                auVar80._8_4_ = uVar65;
                auVar80._12_4_ = uVar65;
                auVar80._16_4_ = uVar65;
                auVar80._20_4_ = uVar65;
                auVar80._24_4_ = uVar65;
                auVar80._28_4_ = uVar65;
                auVar77 = vfmsub132ps_avx512vl(local_5a40,local_59e0,auVar80);
                auVar75 = vpminsd_avx2(ZEXT1632(auVar68),auVar74);
                auVar78 = vpminsd_avx2(ZEXT1632(auVar70),auVar76);
                auVar75 = vpmaxsd_avx2(auVar75,auVar78);
                auVar78 = vpminsd_avx2(ZEXT1632(auVar147),auVar77);
                auVar75 = vpmaxsd_avx2(auVar75,auVar78);
                auVar78 = vpmaxsd_avx2(ZEXT1632(auVar68),auVar74);
                auVar74 = vpmaxsd_avx2(ZEXT1632(auVar70),auVar76);
                auVar74 = vpminsd_avx2(auVar78,auVar74);
                auVar78 = vpmaxsd_avx2(ZEXT1632(auVar147),auVar77);
                auVar74 = vpminsd_avx2(auVar74,auVar78);
                auVar78 = vpmaxsd_avx2(auVar75,local_5960);
                auVar83._4_4_ = uStack_593c;
                auVar83._0_4_ = local_5940;
                auVar83._8_4_ = uStack_5938;
                auVar83._12_4_ = uStack_5934;
                auVar83._16_4_ = uStack_5930;
                auVar83._20_4_ = uStack_592c;
                auVar83._24_4_ = uStack_5928;
                auVar83._28_4_ = uStack_5924;
                auVar74 = vpminsd_avx2(auVar74,auVar83);
                uVar53 = vpcmpd_avx512vl(auVar78,auVar74,2);
                uVar50 = uVar62;
                auVar84 = auVar73;
                if ((byte)uVar53 != 0) {
                  auVar78 = vblendmps_avx512vl(auVar151._0_32_,auVar75);
                  bVar66 = (bool)((byte)uVar53 & 1);
                  auVar84._0_4_ = (uint)bVar66 * auVar78._0_4_ | (uint)!bVar66 * auVar75._0_4_;
                  bVar66 = (bool)((byte)(uVar53 >> 1) & 1);
                  auVar84._4_4_ = (uint)bVar66 * auVar78._4_4_ | (uint)!bVar66 * auVar75._4_4_;
                  bVar66 = (bool)((byte)(uVar53 >> 2) & 1);
                  auVar84._8_4_ = (uint)bVar66 * auVar78._8_4_ | (uint)!bVar66 * auVar75._8_4_;
                  bVar66 = (bool)((byte)(uVar53 >> 3) & 1);
                  auVar84._12_4_ = (uint)bVar66 * auVar78._12_4_ | (uint)!bVar66 * auVar75._12_4_;
                  bVar66 = (bool)((byte)(uVar53 >> 4) & 1);
                  auVar84._16_4_ = (uint)bVar66 * auVar78._16_4_ | (uint)!bVar66 * auVar75._16_4_;
                  bVar66 = (bool)((byte)(uVar53 >> 5) & 1);
                  auVar84._20_4_ = (uint)bVar66 * auVar78._20_4_ | (uint)!bVar66 * auVar75._20_4_;
                  bVar66 = (bool)((byte)(uVar53 >> 6) & 1);
                  auVar84._24_4_ = (uint)bVar66 * auVar78._24_4_ | (uint)!bVar66 * auVar75._24_4_;
                  bVar66 = SUB81(uVar53 >> 7,0);
                  auVar84._28_4_ = (uint)bVar66 * auVar78._28_4_ | (uint)!bVar66 * auVar75._28_4_;
                  uVar50 = uVar56;
                  if (uVar62 != 8) {
                    *puVar61 = uVar62;
                    puVar61 = puVar61 + 1;
                    *pauVar58 = auVar73;
                    pauVar58 = pauVar58 + 1;
                  }
                }
                auVar73 = auVar84;
                uVar62 = uVar50;
              }
              if (uVar62 == 8) goto LAB_01dec88d;
              auVar47._4_4_ = uStack_593c;
              auVar47._0_4_ = local_5940;
              auVar47._8_4_ = uStack_5938;
              auVar47._12_4_ = uStack_5934;
              auVar47._16_4_ = uStack_5930;
              auVar47._20_4_ = uStack_592c;
              auVar47._24_4_ = uStack_5928;
              auVar47._28_4_ = uStack_5924;
              uVar20 = vcmpps_avx512vl(auVar73,auVar47,9);
              root.ptr = uVar62;
            } while ((byte)uVar67 < (byte)POPCOUNT((int)uVar20));
            *puVar61 = uVar62;
            puVar61 = puVar61 + 1;
            *pauVar58 = auVar73;
            pauVar58 = pauVar58 + 1;
LAB_01dec88d:
            iVar52 = 4;
          }
          else {
            while (bVar60 = (byte)local_5fa4, uVar62 != 0) {
              k = 0;
              for (uVar67 = uVar62; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x8000000000000000) {
                k = k + 1;
              }
              local_5f20 = (float)k;
              fStack_5f1c = (float)(k >> 0x20);
              uVar62 = uVar62 - 1 & uVar62;
              bVar66 = occluded1(local_5dd8,local_5de0,root,k,&local_5f89,ray,
                                 (TravRayK<8,_false> *)&local_5b40.field_0,context);
              bVar57 = (byte)(1 << ((uint)local_5f20 & 0x1f));
              if (!bVar66) {
                bVar57 = 0;
              }
              local_5fa4 = (uint)(bVar60 | bVar57);
              uVar67 = local_5ef0;
            }
            iVar52 = 3;
            auVar73 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar149 = ZEXT3264(auVar73);
            auVar73 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            auVar150 = ZEXT3264(auVar73);
            auVar73 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar151 = ZEXT3264(auVar73);
            auVar73 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar152 = ZEXT3264(auVar73);
            auVar68 = vxorps_avx512vl(auVar154._0_16_,auVar154._0_16_);
            auVar154 = ZEXT1664(auVar68);
            auVar129 = ZEXT3264(_local_5ee0);
            if (bVar60 != 0xff) {
              auVar73 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              bVar66 = (bool)((byte)(local_5fa4 >> 1) & 1);
              bVar9 = (bool)((byte)(local_5fa4 >> 2) & 1);
              bVar10 = (bool)((byte)(local_5fa4 >> 3) & 1);
              bVar11 = (bool)((byte)(local_5fa4 >> 4) & 1);
              bVar12 = (bool)((byte)(local_5fa4 >> 5) & 1);
              bVar13 = (bool)((byte)(local_5fa4 >> 6) & 1);
              local_5940 = (uint)(bVar60 & 1) * auVar73._0_4_ | !(bool)(bVar60 & 1) * local_5940;
              uStack_593c = (uint)bVar66 * auVar73._4_4_ | !bVar66 * uStack_593c;
              uStack_5938 = (uint)bVar9 * auVar73._8_4_ | !bVar9 * uStack_5938;
              uStack_5934 = (uint)bVar10 * auVar73._12_4_ | !bVar10 * uStack_5934;
              uStack_5930 = (uint)bVar11 * auVar73._16_4_ | !bVar11 * uStack_5930;
              uStack_592c = (uint)bVar12 * auVar73._20_4_ | !bVar12 * uStack_592c;
              uStack_5928 = (uint)bVar13 * auVar73._24_4_ | !bVar13 * uStack_5928;
              uStack_5924 = (local_5fa4 >> 7) * auVar73._28_4_ |
                            !SUB41(local_5fa4 >> 7,0) * uStack_5924;
              iVar52 = 2;
            }
            if ((uint)uVar67 < (uint)POPCOUNT(uVar65)) goto LAB_01dec727;
          }
          auVar73 = auVar150._0_32_;
          if (iVar52 == 3) {
LAB_01dedb7b:
            local_5fa4._0_1_ = (byte)local_5fa4 & (byte)local_5ee4;
            bVar66 = (bool)((byte)local_5fa4 >> 1 & 1);
            bVar9 = (bool)((byte)local_5fa4 >> 2 & 1);
            bVar10 = (bool)((byte)local_5fa4 >> 3 & 1);
            bVar11 = (bool)((byte)local_5fa4 >> 4 & 1);
            bVar12 = (bool)((byte)local_5fa4 >> 5 & 1);
            bVar13 = (bool)((byte)local_5fa4 >> 6 & 1);
            *(uint *)local_5e88 =
                 (uint)((byte)local_5fa4 & 1) * auVar73._0_4_ |
                 (uint)!(bool)((byte)local_5fa4 & 1) * *(int *)local_5e88;
            *(uint *)(local_5e88 + 4) =
                 (uint)bVar66 * auVar73._4_4_ | (uint)!bVar66 * *(int *)(local_5e88 + 4);
            *(uint *)(local_5e88 + 8) =
                 (uint)bVar9 * auVar73._8_4_ | (uint)!bVar9 * *(int *)(local_5e88 + 8);
            *(uint *)(local_5e88 + 0xc) =
                 (uint)bVar10 * auVar73._12_4_ | (uint)!bVar10 * *(int *)(local_5e88 + 0xc);
            *(uint *)(local_5e88 + 0x10) =
                 (uint)bVar11 * auVar73._16_4_ | (uint)!bVar11 * *(int *)(local_5e88 + 0x10);
            *(uint *)(local_5e88 + 0x14) =
                 (uint)bVar12 * auVar73._20_4_ | (uint)!bVar12 * *(int *)(local_5e88 + 0x14);
            *(uint *)(local_5e88 + 0x18) =
                 (uint)bVar13 * auVar73._24_4_ | (uint)!bVar13 * *(int *)(local_5e88 + 0x18);
            *(uint *)(local_5e88 + 0x1c) =
                 (uint)((byte)local_5fa4 >> 7) * auVar73._28_4_ |
                 (uint)!(bool)((byte)local_5fa4 >> 7) * *(int *)(local_5e88 + 0x1c);
            return;
          }
        } while( true );
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }